

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::avx2::CurveNiMBIntersector1<4>::
     occluded_n<embree::avx2::OrientedCurve1Intersector1<embree::BSplineCurveT,7,8>,embree::avx2::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  long lVar2;
  undefined1 (*pauVar3) [12];
  float *pfVar4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  Primitive PVar7;
  Geometry *pGVar8;
  __int_type_conflict _Var9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  RTCFilterFunctionN p_Var14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  int iVar28;
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  bool bVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [12];
  undefined1 auVar62 [12];
  uint uVar63;
  uint uVar64;
  uint uVar65;
  uint uVar66;
  ulong uVar67;
  long lVar69;
  byte bVar70;
  uint uVar71;
  ulong uVar72;
  ulong uVar73;
  long lVar74;
  undefined1 auVar75 [8];
  float fVar76;
  float fVar77;
  undefined4 uVar78;
  vint4 bi_2;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [32];
  vint4 bi_1;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  float fVar116;
  float fVar137;
  float fVar138;
  vint4 bi;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  float fVar139;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  float fVar140;
  float fVar141;
  float fVar160;
  float fVar161;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  float fVar162;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  vint4 ai_2;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  float fVar185;
  float fVar201;
  float fVar202;
  vint4 ai_1;
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [32];
  undefined8 uVar203;
  float fVar222;
  vint4 ai;
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  float fVar224;
  float fVar225;
  float fVar226;
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  float fVar221;
  float fVar223;
  undefined1 auVar220 [32];
  float fVar227;
  float fVar244;
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [32];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [32];
  float fVar262;
  float fVar273;
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [32];
  float fVar286;
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  float fVar287;
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [32];
  float fVar311;
  undefined1 auVar301 [16];
  float fVar312;
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar327 [32];
  undefined1 auVar328 [32];
  undefined1 auVar326 [16];
  undefined1 auVar329 [64];
  undefined1 auVar330 [64];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [32];
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  bool local_549;
  undefined1 local_518 [8];
  float fStack_510;
  float fStack_50c;
  undefined1 local_4f8 [8];
  float fStack_4f0;
  float fStack_4ec;
  undefined1 local_4e8 [8];
  undefined8 uStack_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  float local_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  undefined1 local_4a8 [8];
  float fStack_4a0;
  float fStack_49c;
  int local_46c;
  undefined1 local_468 [8];
  float fStack_460;
  float fStack_45c;
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float local_448;
  float fStack_444;
  undefined4 uStack_440;
  undefined4 uStack_43c;
  float fStack_438;
  float fStack_434;
  float fStack_430;
  undefined4 uStack_42c;
  undefined1 local_428 [8];
  float fStack_420;
  float fStack_41c;
  undefined1 local_418 [8];
  float fStack_410;
  float fStack_40c;
  undefined1 local_408 [8];
  float fStack_400;
  float fStack_3fc;
  undefined1 local_3f8 [16];
  undefined1 local_3e8 [16];
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [16];
  undefined1 local_3b8 [8];
  float fStack_3b0;
  float fStack_3ac;
  undefined1 local_3a8 [16];
  undefined1 local_398 [16];
  undefined1 local_388 [16];
  undefined1 local_378 [16];
  uint local_368;
  uint uStack_364;
  uint uStack_360;
  uint uStack_35c;
  undefined1 local_358 [8];
  float fStack_350;
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  undefined1 local_318 [32];
  ulong local_2f8;
  Primitive *local_2f0;
  RTCFilterFunctionNArguments local_2e8;
  undefined1 local_2b8 [8];
  float fStack_2b0;
  float fStack_2ac;
  uint auStack_2a8 [4];
  undefined8 local_298;
  undefined4 local_290;
  undefined8 local_28c;
  undefined4 local_284;
  uint local_280;
  uint local_27c;
  uint local_278;
  undefined1 local_268 [32];
  undefined1 local_248 [8];
  float fStack_240;
  float fStack_23c;
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [32];
  uint uStack_1b8;
  float afStack_1b4 [7];
  uint local_198;
  uint uStack_194;
  uint uStack_190;
  uint uStack_18c;
  uint uStack_188;
  uint uStack_184;
  uint uStack_180;
  uint uStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  undefined1 local_158 [32];
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar68;
  undefined1 auVar157 [32];
  float fVar274;
  float fVar285;
  
  PVar7 = prim[1];
  uVar67 = (ulong)(byte)PVar7;
  lVar69 = uVar67 * 0x25;
  auVar21 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + lVar69 + 6));
  fVar185 = *(float *)(prim + lVar69 + 0x12);
  auVar253._0_4_ = fVar185 * auVar21._0_4_;
  auVar253._4_4_ = fVar185 * auVar21._4_4_;
  auVar253._8_4_ = fVar185 * auVar21._8_4_;
  auVar253._12_4_ = fVar185 * auVar21._12_4_;
  auVar100._0_4_ = fVar185 * (ray->dir).field_0.m128[0];
  auVar100._4_4_ = fVar185 * (ray->dir).field_0.m128[1];
  auVar100._8_4_ = fVar185 * (ray->dir).field_0.m128[2];
  auVar100._12_4_ = fVar185 * (ray->dir).field_0.m128[3];
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 4 + 6)));
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 5 + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar129 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 6 + 6)));
  auVar129 = vcvtdq2ps_avx(auVar129);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 0xf + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar7 * 0x10 + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar168 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar7 * 0x10 + uVar67 + 6)));
  auVar168 = vcvtdq2ps_avx(auVar168);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 0x1a + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar165 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 0x1b + 6)));
  auVar165 = vcvtdq2ps_avx(auVar165);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 0x1c + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar323._4_4_ = auVar100._0_4_;
  auVar323._0_4_ = auVar100._0_4_;
  auVar323._8_4_ = auVar100._0_4_;
  auVar323._12_4_ = auVar100._0_4_;
  auVar20 = vshufps_avx(auVar100,auVar100,0x55);
  auVar313 = vshufps_avx(auVar100,auVar100,0xaa);
  fVar185 = auVar313._0_4_;
  auVar275._0_4_ = fVar185 * auVar129._0_4_;
  fVar201 = auVar313._4_4_;
  auVar275._4_4_ = fVar201 * auVar129._4_4_;
  fVar202 = auVar313._8_4_;
  auVar275._8_4_ = fVar202 * auVar129._8_4_;
  fVar77 = auVar313._12_4_;
  auVar275._12_4_ = fVar77 * auVar129._12_4_;
  auVar263._0_4_ = auVar168._0_4_ * fVar185;
  auVar263._4_4_ = auVar168._4_4_ * fVar201;
  auVar263._8_4_ = auVar168._8_4_ * fVar202;
  auVar263._12_4_ = auVar168._12_4_ * fVar77;
  auVar245._0_4_ = auVar19._0_4_ * fVar185;
  auVar245._4_4_ = auVar19._4_4_ * fVar201;
  auVar245._8_4_ = auVar19._8_4_ * fVar202;
  auVar245._12_4_ = auVar19._12_4_ * fVar77;
  auVar313 = vfmadd231ps_fma(auVar275,auVar20,auVar15);
  auVar127 = vfmadd231ps_fma(auVar263,auVar20,auVar17);
  auVar20 = vfmadd231ps_fma(auVar245,auVar165,auVar20);
  auVar80 = vfmadd231ps_fma(auVar313,auVar323,auVar21);
  auVar127 = vfmadd231ps_fma(auVar127,auVar323,auVar16);
  auVar81 = vfmadd231ps_fma(auVar20,auVar18,auVar323);
  auVar324._4_4_ = auVar253._0_4_;
  auVar324._0_4_ = auVar253._0_4_;
  auVar324._8_4_ = auVar253._0_4_;
  auVar324._12_4_ = auVar253._0_4_;
  auVar20 = vshufps_avx(auVar253,auVar253,0x55);
  auVar313 = vshufps_avx(auVar253,auVar253,0xaa);
  fVar185 = auVar313._0_4_;
  auVar117._0_4_ = fVar185 * auVar129._0_4_;
  fVar201 = auVar313._4_4_;
  auVar117._4_4_ = fVar201 * auVar129._4_4_;
  fVar202 = auVar313._8_4_;
  auVar117._8_4_ = fVar202 * auVar129._8_4_;
  fVar77 = auVar313._12_4_;
  auVar117._12_4_ = fVar77 * auVar129._12_4_;
  auVar93._0_4_ = auVar168._0_4_ * fVar185;
  auVar93._4_4_ = auVar168._4_4_ * fVar201;
  auVar93._8_4_ = auVar168._8_4_ * fVar202;
  auVar93._12_4_ = auVar168._12_4_ * fVar77;
  auVar79._0_4_ = auVar19._0_4_ * fVar185;
  auVar79._4_4_ = auVar19._4_4_ * fVar201;
  auVar79._8_4_ = auVar19._8_4_ * fVar202;
  auVar79._12_4_ = auVar19._12_4_ * fVar77;
  auVar15 = vfmadd231ps_fma(auVar117,auVar20,auVar15);
  auVar129 = vfmadd231ps_fma(auVar93,auVar20,auVar17);
  auVar17 = vfmadd231ps_fma(auVar79,auVar20,auVar165);
  auVar93 = vfmadd231ps_fma(auVar15,auVar324,auVar21);
  auVar94 = vfmadd231ps_fma(auVar129,auVar324,auVar16);
  auVar175 = vfmadd231ps_fma(auVar17,auVar324,auVar18);
  local_328._8_4_ = 0x7fffffff;
  local_328._0_8_ = 0x7fffffff7fffffff;
  local_328._12_4_ = 0x7fffffff;
  auVar21 = vandps_avx(auVar80,local_328);
  auVar204._8_4_ = 0x219392ef;
  auVar204._0_8_ = 0x219392ef219392ef;
  auVar204._12_4_ = 0x219392ef;
  auVar21 = vcmpps_avx(auVar21,auVar204,1);
  auVar15 = vblendvps_avx(auVar80,auVar204,auVar21);
  auVar21 = vandps_avx(auVar127,local_328);
  auVar21 = vcmpps_avx(auVar21,auVar204,1);
  auVar129 = vblendvps_avx(auVar127,auVar204,auVar21);
  auVar21 = vandps_avx(auVar81,local_328);
  auVar21 = vcmpps_avx(auVar21,auVar204,1);
  auVar21 = vblendvps_avx(auVar81,auVar204,auVar21);
  auVar16 = vrcpps_avx(auVar15);
  auVar228._8_4_ = 0x3f800000;
  auVar228._0_8_ = &DAT_3f8000003f800000;
  auVar228._12_4_ = 0x3f800000;
  auVar15 = vfnmadd213ps_fma(auVar15,auVar16,auVar228);
  auVar80 = vfmadd132ps_fma(auVar15,auVar16,auVar16);
  auVar15 = vrcpps_avx(auVar129);
  auVar129 = vfnmadd213ps_fma(auVar129,auVar15,auVar228);
  auVar81 = vfmadd132ps_fma(auVar129,auVar15,auVar15);
  auVar15 = vrcpps_avx(auVar21);
  auVar21 = vfnmadd213ps_fma(auVar21,auVar15,auVar228);
  auVar253 = vfmadd132ps_fma(auVar21,auVar15,auVar15);
  fVar185 = ((ray->dir).field_0.m128[3] - *(float *)(prim + lVar69 + 0x16)) *
            *(float *)(prim + lVar69 + 0x1a);
  auVar205._4_4_ = fVar185;
  auVar205._0_4_ = fVar185;
  auVar205._8_4_ = fVar185;
  auVar205._12_4_ = fVar185;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar67 * 7 + 6);
  auVar21 = vpmovsxwd_avx(auVar21);
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar67 * 0xb + 6);
  auVar15 = vpmovsxwd_avx(auVar15);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vsubps_avx(auVar15,auVar21);
  auVar129._8_8_ = 0;
  auVar129._0_8_ = *(ulong *)(prim + uVar67 * 9 + 6);
  auVar15 = vpmovsxwd_avx(auVar129);
  auVar79 = vfmadd213ps_fma(auVar16,auVar205,auVar21);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar67 * 0xd + 6);
  auVar129 = vpmovsxwd_avx(auVar16);
  auVar21 = vcvtdq2ps_avx(auVar15);
  auVar15 = vcvtdq2ps_avx(auVar129);
  auVar15 = vsubps_avx(auVar15,auVar21);
  auVar16 = vfmadd213ps_fma(auVar15,auVar205,auVar21);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar67 * 0x12 + 6);
  auVar21 = vpmovsxwd_avx(auVar17);
  auVar21 = vcvtdq2ps_avx(auVar21);
  uVar73 = (ulong)(uint)((int)(uVar67 * 5) << 2);
  auVar168._8_8_ = 0;
  auVar168._0_8_ = *(ulong *)(prim + uVar67 * 2 + uVar73 + 6);
  auVar15 = vpmovsxwd_avx(auVar168);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar129 = vsubps_avx(auVar15,auVar21);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar73 + 6);
  auVar15 = vpmovsxwd_avx(auVar18);
  auVar129 = vfmadd213ps_fma(auVar129,auVar205,auVar21);
  auVar21 = vcvtdq2ps_avx(auVar15);
  auVar165._8_8_ = 0;
  auVar165._0_8_ = *(ulong *)(prim + uVar67 * 0x18 + 6);
  auVar15 = vpmovsxwd_avx(auVar165);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar15 = vsubps_avx(auVar15,auVar21);
  auVar17 = vfmadd213ps_fma(auVar15,auVar205,auVar21);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar67 * 0x1d + 6);
  auVar21 = vpmovsxwd_avx(auVar19);
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar67 + (ulong)(byte)PVar7 * 0x20 + 6);
  auVar15 = vpmovsxwd_avx(auVar20);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar15 = vsubps_avx(auVar15,auVar21);
  auVar168 = vfmadd213ps_fma(auVar15,auVar205,auVar21);
  auVar313._8_8_ = 0;
  auVar313._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar7 * 0x20 - uVar67) + 6);
  auVar21 = vpmovsxwd_avx(auVar313);
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar127._8_8_ = 0;
  auVar127._0_8_ = *(ulong *)(prim + uVar67 * 0x23 + 6);
  auVar15 = vpmovsxwd_avx(auVar127);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar15 = vsubps_avx(auVar15,auVar21);
  auVar15 = vfmadd213ps_fma(auVar15,auVar205,auVar21);
  auVar21 = vsubps_avx(auVar79,auVar93);
  auVar206._0_4_ = auVar80._0_4_ * auVar21._0_4_;
  auVar206._4_4_ = auVar80._4_4_ * auVar21._4_4_;
  auVar206._8_4_ = auVar80._8_4_ * auVar21._8_4_;
  auVar206._12_4_ = auVar80._12_4_ * auVar21._12_4_;
  auVar21 = vsubps_avx(auVar16,auVar93);
  auVar118._0_4_ = auVar80._0_4_ * auVar21._0_4_;
  auVar118._4_4_ = auVar80._4_4_ * auVar21._4_4_;
  auVar118._8_4_ = auVar80._8_4_ * auVar21._8_4_;
  auVar118._12_4_ = auVar80._12_4_ * auVar21._12_4_;
  auVar21 = vsubps_avx(auVar129,auVar94);
  auVar186._0_4_ = auVar81._0_4_ * auVar21._0_4_;
  auVar186._4_4_ = auVar81._4_4_ * auVar21._4_4_;
  auVar186._8_4_ = auVar81._8_4_ * auVar21._8_4_;
  auVar186._12_4_ = auVar81._12_4_ * auVar21._12_4_;
  auVar21 = vsubps_avx(auVar17,auVar94);
  auVar94._0_4_ = auVar81._0_4_ * auVar21._0_4_;
  auVar94._4_4_ = auVar81._4_4_ * auVar21._4_4_;
  auVar94._8_4_ = auVar81._8_4_ * auVar21._8_4_;
  auVar94._12_4_ = auVar81._12_4_ * auVar21._12_4_;
  auVar21 = vsubps_avx(auVar168,auVar175);
  auVar163._0_4_ = auVar253._0_4_ * auVar21._0_4_;
  auVar163._4_4_ = auVar253._4_4_ * auVar21._4_4_;
  auVar163._8_4_ = auVar253._8_4_ * auVar21._8_4_;
  auVar163._12_4_ = auVar253._12_4_ * auVar21._12_4_;
  auVar21 = vsubps_avx(auVar15,auVar175);
  auVar80._0_4_ = auVar253._0_4_ * auVar21._0_4_;
  auVar80._4_4_ = auVar253._4_4_ * auVar21._4_4_;
  auVar80._8_4_ = auVar253._8_4_ * auVar21._8_4_;
  auVar80._12_4_ = auVar253._12_4_ * auVar21._12_4_;
  auVar21 = vpminsd_avx(auVar206,auVar118);
  auVar15 = vpminsd_avx(auVar186,auVar94);
  auVar21 = vmaxps_avx(auVar21,auVar15);
  auVar15 = vpminsd_avx(auVar163,auVar80);
  uVar78 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar246._4_4_ = uVar78;
  auVar246._0_4_ = uVar78;
  auVar246._8_4_ = uVar78;
  auVar246._12_4_ = uVar78;
  auVar15 = vmaxps_avx(auVar15,auVar246);
  auVar21 = vmaxps_avx(auVar21,auVar15);
  local_208._0_4_ = auVar21._0_4_ * 0.99999964;
  local_208._4_4_ = auVar21._4_4_ * 0.99999964;
  local_208._8_4_ = auVar21._8_4_ * 0.99999964;
  local_208._12_4_ = auVar21._12_4_ * 0.99999964;
  auVar21 = vpmaxsd_avx(auVar206,auVar118);
  auVar15 = vpmaxsd_avx(auVar186,auVar94);
  auVar21 = vminps_avx(auVar21,auVar15);
  auVar15 = vpmaxsd_avx(auVar163,auVar80);
  fVar185 = ray->tfar;
  auVar119._4_4_ = fVar185;
  auVar119._0_4_ = fVar185;
  auVar119._8_4_ = fVar185;
  auVar119._12_4_ = fVar185;
  auVar15 = vminps_avx(auVar15,auVar119);
  auVar21 = vminps_avx(auVar21,auVar15);
  auVar81._0_4_ = auVar21._0_4_ * 1.0000004;
  auVar81._4_4_ = auVar21._4_4_ * 1.0000004;
  auVar81._8_4_ = auVar21._8_4_ * 1.0000004;
  auVar81._12_4_ = auVar21._12_4_ * 1.0000004;
  auVar175._1_3_ = 0;
  auVar175[0] = PVar7;
  auVar175[4] = PVar7;
  auVar175._5_3_ = 0;
  auVar175[8] = PVar7;
  auVar175._9_3_ = 0;
  auVar175[0xc] = PVar7;
  auVar175._13_3_ = 0;
  auVar15 = vpcmpgtd_avx(auVar175,_DAT_01ff0cf0);
  auVar21 = vcmpps_avx(local_208,auVar81,2);
  auVar21 = vandps_avx(auVar21,auVar15);
  uVar63 = vmovmskps_avx(auVar21);
  local_549 = uVar63 != 0;
  if (uVar63 == 0) {
    return local_549;
  }
  uVar63 = uVar63 & 0xff;
  auVar92._16_16_ = mm_lookupmask_ps._240_16_;
  auVar92._0_16_ = mm_lookupmask_ps._240_16_;
  local_1d8 = vblendps_avx(auVar92,ZEXT832(0) << 0x20,0x80);
  local_368 = 0x80000000;
  uStack_364 = 0x80000000;
  uStack_360 = 0x80000000;
  uStack_35c = 0x80000000;
  local_2f0 = prim;
LAB_0178a3a1:
  lVar69 = 0;
  for (uVar67 = (ulong)uVar63; (uVar67 & 1) == 0; uVar67 = uVar67 >> 1 | 0x8000000000000000) {
    lVar69 = lVar69 + 1;
  }
  uVar66 = *(uint *)(local_2f0 + 2);
  local_2f8 = (ulong)*(uint *)(local_2f0 + lVar69 * 4 + 6);
  pGVar8 = (context->scene->geometries).items[uVar66].ptr;
  fVar185 = (pGVar8->time_range).lower;
  fVar202 = pGVar8->fnumTimeSegments *
            (((ray->dir).field_0.m128[3] - fVar185) / ((pGVar8->time_range).upper - fVar185));
  auVar21 = vroundss_avx(ZEXT416((uint)fVar202),ZEXT416((uint)fVar202),9);
  auVar21 = vminss_avx(auVar21,ZEXT416((uint)(pGVar8->fnumTimeSegments + -1.0)));
  auVar20 = vmaxss_avx(ZEXT816(0),auVar21);
  uVar67 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           local_2f8 *
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var9 = pGVar8[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar74 = (long)(int)auVar20._0_4_ * 0x38;
  lVar10 = *(long *)(_Var9 + lVar74);
  lVar11 = *(long *)(_Var9 + 0x10 + lVar74);
  auVar21 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar67);
  lVar69 = uVar67 + 1;
  auVar15 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar69);
  lVar1 = uVar67 + 2;
  auVar129 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
  lVar2 = uVar67 + 3;
  pauVar3 = (undefined1 (*) [12])(lVar10 + lVar11 * lVar2);
  auVar61 = *pauVar3;
  fVar185 = *(float *)pauVar3[1];
  lVar10 = *(long *)&pGVar8[4].fnumTimeSegments;
  lVar11 = *(long *)(lVar10 + lVar74);
  lVar12 = *(long *)(lVar10 + 0x10 + lVar74);
  auVar16 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar67);
  auVar17 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar69);
  auVar168 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar1);
  pfVar4 = (float *)(lVar11 + lVar12 * lVar2);
  fVar201 = *pfVar4;
  fVar77 = pfVar4[1];
  fVar76 = pfVar4[2];
  fVar141 = pfVar4[3];
  auVar313 = ZEXT816(0) << 0x40;
  auVar276._0_4_ = *(float *)*pauVar3 * 0.0;
  auVar276._4_4_ = *(float *)(*pauVar3 + 4) * 0.0;
  auVar276._8_4_ = *(float *)(*pauVar3 + 8) * 0.0;
  auVar276._12_4_ = fVar185 * 0.0;
  auVar142._8_4_ = 0x3e2aaaab;
  auVar142._0_8_ = 0x3e2aaaab3e2aaaab;
  auVar142._12_4_ = 0x3e2aaaab;
  auVar80 = vfmadd213ps_fma(auVar142,auVar129,auVar276);
  auVar164._8_4_ = 0x3f000000;
  auVar164._0_8_ = 0x3f0000003f000000;
  auVar164._12_4_ = 0x3f000000;
  auVar18 = vfmadd231ps_fma(auVar276,auVar129,auVar164);
  auVar18 = vfnmadd231ps_fma(auVar18,auVar15,auVar313);
  auVar118 = vfnmadd231ps_fma(auVar18,auVar21,auVar164);
  auVar187._0_4_ = fVar201 * 0.0;
  auVar187._4_4_ = fVar77 * 0.0;
  auVar187._8_4_ = fVar76 * 0.0;
  auVar187._12_4_ = fVar141 * 0.0;
  auVar18 = vfmadd213ps_fma(auVar142,auVar168,auVar187);
  auVar143._8_4_ = 0x3f2aaaab;
  auVar143._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar143._12_4_ = 0x3f2aaaab;
  auVar18 = vfmadd231ps_fma(auVar18,auVar17,auVar143);
  auVar18 = vfmadd231ps_fma(auVar18,auVar16,auVar142);
  auVar165 = vfmadd231ps_fma(auVar187,auVar168,auVar164);
  auVar165 = vfnmadd231ps_fma(auVar165,auVar17,auVar313);
  auVar19 = vfnmadd231ps_fma(auVar165,auVar16,auVar164);
  auVar301._0_4_ = *(float *)*pauVar3 * 0.5;
  auVar301._4_4_ = *(float *)(*pauVar3 + 4) * 0.5;
  auVar301._8_4_ = *(float *)(*pauVar3 + 8) * 0.5;
  auVar301._12_4_ = fVar185 * 0.5;
  auVar165 = vfmadd231ps_fma(auVar301,auVar313,auVar129);
  auVar165 = vfnmadd231ps_fma(auVar165,auVar164,auVar15);
  auVar119 = vfnmadd231ps_fma(auVar165,auVar313,auVar21);
  auVar264._0_4_ = fVar201 * 0.16666667;
  auVar264._4_4_ = fVar77 * 0.16666667;
  auVar264._8_4_ = fVar76 * 0.16666667;
  auVar264._12_4_ = fVar141 * 0.16666667;
  auVar165 = vfmadd231ps_fma(auVar264,auVar168,auVar143);
  auVar165 = vfmadd231ps_fma(auVar165,auVar17,auVar142);
  auVar165 = vfmadd231ps_fma(auVar165,auVar16,auVar313);
  auVar229._0_4_ = fVar201 * 0.5;
  auVar229._4_4_ = fVar77 * 0.5;
  auVar229._8_4_ = fVar76 * 0.5;
  auVar229._12_4_ = fVar141 * 0.5;
  auVar168 = vfmadd231ps_fma(auVar229,auVar313,auVar168);
  auVar17 = vfnmadd231ps_fma(auVar168,auVar164,auVar17);
  auVar168 = vfnmadd231ps_fma(auVar17,auVar313,auVar16);
  auVar16 = vshufps_avx(auVar118,auVar118,0xc9);
  auVar17 = vshufps_avx(auVar18,auVar18,0xc9);
  fVar227 = auVar118._0_4_;
  auVar95._0_4_ = fVar227 * auVar17._0_4_;
  fVar244 = auVar118._4_4_;
  auVar95._4_4_ = fVar244 * auVar17._4_4_;
  fVar262 = auVar118._8_4_;
  auVar95._8_4_ = fVar262 * auVar17._8_4_;
  fVar273 = auVar118._12_4_;
  auVar95._12_4_ = fVar273 * auVar17._12_4_;
  auVar253 = vfmsub231ps_fma(auVar95,auVar16,auVar18);
  auVar17 = vshufps_avx(auVar19,auVar19,0xc9);
  auVar96._0_4_ = fVar227 * auVar17._0_4_;
  auVar96._4_4_ = fVar244 * auVar17._4_4_;
  auVar96._8_4_ = fVar262 * auVar17._8_4_;
  auVar96._12_4_ = fVar273 * auVar17._12_4_;
  auVar79 = vfmsub231ps_fma(auVar96,auVar16,auVar19);
  auVar16 = vshufps_avx(auVar119,auVar119,0xc9);
  auVar17 = vshufps_avx(auVar165,auVar165,0xc9);
  fVar274 = auVar119._0_4_;
  auVar97._0_4_ = fVar274 * auVar17._0_4_;
  fVar285 = auVar119._4_4_;
  auVar97._4_4_ = fVar285 * auVar17._4_4_;
  fVar311 = auVar119._8_4_;
  auVar97._8_4_ = fVar311 * auVar17._8_4_;
  fVar312 = auVar119._12_4_;
  auVar97._12_4_ = fVar312 * auVar17._12_4_;
  auVar93 = vfmsub231ps_fma(auVar97,auVar16,auVar165);
  auVar17 = vshufps_avx(auVar168,auVar168,0xc9);
  auVar98._0_4_ = fVar274 * auVar17._0_4_;
  auVar98._4_4_ = fVar285 * auVar17._4_4_;
  auVar98._8_4_ = fVar311 * auVar17._8_4_;
  auVar98._12_4_ = fVar312 * auVar17._12_4_;
  auVar94 = vfmsub231ps_fma(auVar98,auVar16,auVar168);
  lVar11 = *(long *)(_Var9 + 0x38 + lVar74);
  lVar12 = *(long *)(_Var9 + 0x48 + lVar74);
  auVar16 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar1);
  pauVar3 = (undefined1 (*) [12])(lVar11 + lVar12 * lVar2);
  auVar62 = *pauVar3;
  fVar141 = *(float *)pauVar3[1];
  lVar13 = *(long *)(lVar10 + 0x38 + lVar74);
  lVar10 = *(long *)(lVar10 + 0x48 + lVar74);
  auVar265._0_4_ = *(float *)*pauVar3 * 0.0;
  auVar265._4_4_ = *(float *)(*pauVar3 + 4) * 0.0;
  auVar265._8_4_ = *(float *)(*pauVar3 + 8) * 0.0;
  auVar265._12_4_ = fVar141 * 0.0;
  auVar81 = vfmadd213ps_fma(auVar142,auVar16,auVar265);
  auVar168 = vfmadd231ps_fma(auVar265,auVar16,auVar164);
  auVar17 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar69);
  auVar18 = vfnmadd231ps_fma(auVar168,auVar17,ZEXT816(0) << 0x20);
  auVar168 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar67);
  auVar163 = vfnmadd231ps_fma(auVar18,auVar168,auVar164);
  auVar18 = *(undefined1 (*) [16])(lVar13 + lVar1 * lVar10);
  pfVar4 = (float *)(lVar13 + lVar10 * lVar2);
  fVar201 = *pfVar4;
  fVar77 = pfVar4[1];
  fVar76 = pfVar4[2];
  fVar116 = pfVar4[3];
  auVar82._0_4_ = fVar201 * 0.0;
  auVar82._4_4_ = fVar77 * 0.0;
  auVar82._8_4_ = fVar76 * 0.0;
  auVar82._12_4_ = fVar116 * 0.0;
  auVar19 = vfmadd213ps_fma(auVar142,auVar18,auVar82);
  auVar165 = *(undefined1 (*) [16])(lVar13 + lVar69 * lVar10);
  auVar99._8_4_ = 0x3f2aaaab;
  auVar99._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar99._12_4_ = 0x3f2aaaab;
  auVar313 = vfmadd231ps_fma(auVar19,auVar165,auVar99);
  auVar19 = *(undefined1 (*) [16])(lVar13 + uVar67 * lVar10);
  auVar127 = vfmadd231ps_fma(auVar313,auVar19,auVar142);
  auVar313 = vshufps_avx(auVar127,auVar127,0xc9);
  fVar223 = auVar163._0_4_;
  auVar188._0_4_ = fVar223 * auVar313._0_4_;
  fVar224 = auVar163._4_4_;
  auVar188._4_4_ = fVar224 * auVar313._4_4_;
  fVar225 = auVar163._8_4_;
  auVar188._8_4_ = fVar225 * auVar313._8_4_;
  fVar226 = auVar163._12_4_;
  auVar188._12_4_ = fVar226 * auVar313._12_4_;
  auVar313 = vshufps_avx(auVar163,auVar163,0xc9);
  auVar175 = vfmsub231ps_fma(auVar188,auVar313,auVar127);
  auVar189._8_4_ = 0x3f000000;
  auVar189._0_8_ = 0x3f0000003f000000;
  auVar189._12_4_ = 0x3f000000;
  auVar127 = vfmadd231ps_fma(auVar82,auVar18,auVar189);
  auVar127 = vfnmadd231ps_fma(auVar127,auVar165,_DAT_01feba10);
  auVar100 = vfnmadd231ps_fma(auVar127,auVar19,auVar189);
  auVar127 = vshufps_avx(auVar100,auVar100,0xc9);
  auVar288._0_4_ = fVar223 * auVar127._0_4_;
  auVar288._4_4_ = fVar224 * auVar127._4_4_;
  auVar288._8_4_ = fVar225 * auVar127._8_4_;
  auVar288._12_4_ = fVar226 * auVar127._12_4_;
  auVar127 = vfmsub231ps_fma(auVar288,auVar313,auVar100);
  auVar83._0_4_ = fVar201 * 0.16666667;
  auVar83._4_4_ = fVar77 * 0.16666667;
  auVar83._8_4_ = fVar76 * 0.16666667;
  auVar83._12_4_ = fVar116 * 0.16666667;
  auVar207._8_4_ = 0x3f2aaaab;
  auVar207._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar207._12_4_ = 0x3f2aaaab;
  auVar313 = vfmadd231ps_fma(auVar83,auVar18,auVar207);
  auVar144._0_4_ = fVar201 * 0.5;
  auVar144._4_4_ = fVar77 * 0.5;
  auVar144._8_4_ = fVar76 * 0.5;
  auVar144._12_4_ = fVar116 * 0.5;
  auVar100 = ZEXT816(0) << 0x20;
  auVar18 = vfmadd231ps_fma(auVar144,auVar100,auVar18);
  auVar313 = vfmadd231ps_fma(auVar313,auVar165,auVar142);
  auVar18 = vfnmadd231ps_fma(auVar18,auVar189,auVar165);
  auVar165 = vfmadd231ps_fma(auVar313,auVar19,auVar100);
  auVar19 = vfnmadd231ps_fma(auVar18,auVar100,auVar19);
  auVar190._0_4_ = *(float *)*pauVar3 * 0.5;
  auVar190._4_4_ = *(float *)(*pauVar3 + 4) * 0.5;
  auVar190._8_4_ = *(float *)(*pauVar3 + 8) * 0.5;
  auVar190._12_4_ = fVar141 * 0.5;
  auVar18 = vfmadd231ps_fma(auVar190,auVar100,auVar16);
  auVar18 = vfnmadd231ps_fma(auVar18,auVar189,auVar17);
  auVar186 = vfnmadd231ps_fma(auVar18,auVar100,auVar168);
  auVar18 = vshufps_avx(auVar165,auVar165,0xc9);
  fVar221 = auVar186._0_4_;
  auVar101._0_4_ = fVar221 * auVar18._0_4_;
  fVar286 = auVar186._4_4_;
  auVar101._4_4_ = fVar286 * auVar18._4_4_;
  fVar222 = auVar186._8_4_;
  auVar101._8_4_ = fVar222 * auVar18._8_4_;
  fVar287 = auVar186._12_4_;
  auVar101._12_4_ = fVar287 * auVar18._12_4_;
  auVar18 = vshufps_avx(auVar186,auVar186,0xc9);
  auVar100 = vfmsub231ps_fma(auVar101,auVar18,auVar165);
  auVar165 = vshufps_avx(auVar19,auVar19,0xc9);
  auVar84._0_4_ = fVar221 * auVar165._0_4_;
  auVar84._4_4_ = fVar286 * auVar165._4_4_;
  auVar84._8_4_ = fVar222 * auVar165._8_4_;
  auVar84._12_4_ = fVar287 * auVar165._12_4_;
  auVar117 = vfmsub231ps_fma(auVar84,auVar18,auVar19);
  fVar202 = fVar202 - auVar20._0_4_;
  local_4f8._0_4_ = auVar61._0_4_;
  local_4f8._4_4_ = auVar61._4_4_;
  fStack_4f0 = auVar61._8_4_;
  auVar102._0_4_ = (float)local_4f8._0_4_ * 0.16666667;
  auVar102._4_4_ = (float)local_4f8._4_4_ * 0.16666667;
  auVar102._8_4_ = fStack_4f0 * 0.16666667;
  auVar102._12_4_ = fVar185 * 0.16666667;
  auVar129 = vfmadd231ps_fma(auVar102,auVar207,auVar129);
  auVar18 = vfmadd231ps_fma(auVar80,auVar15,auVar207);
  auVar165 = vfmadd231ps_fma(auVar129,auVar15,auVar142);
  auVar20 = vfmadd231ps_fma(auVar18,auVar21,auVar142);
  auVar129 = vpermilps_avx(auVar253,0xc9);
  auVar15 = vdpps_avx(auVar129,auVar129,0x7f);
  auVar313 = vfmadd231ps_fma(auVar165,auVar21,ZEXT816(0));
  fVar201 = auVar15._0_4_;
  auVar165 = ZEXT416((uint)fVar201);
  auVar21 = vrsqrtss_avx(auVar165,auVar165);
  fVar185 = auVar21._0_4_;
  fVar185 = fVar201 * -0.5 * fVar185 * fVar185 * fVar185 + fVar185 * 1.5;
  auVar21 = vpermilps_avx(auVar79,0xc9);
  auVar331._0_4_ = fVar201 * auVar21._0_4_;
  auVar331._4_4_ = fVar201 * auVar21._4_4_;
  auVar331._8_4_ = fVar201 * auVar21._8_4_;
  auVar331._12_4_ = fVar201 * auVar21._12_4_;
  auVar21 = vdpps_avx(auVar129,auVar21,0x7f);
  fVar201 = auVar21._0_4_;
  auVar247._0_4_ = fVar201 * auVar129._0_4_;
  auVar247._4_4_ = fVar201 * auVar129._4_4_;
  auVar247._8_4_ = fVar201 * auVar129._8_4_;
  auVar247._12_4_ = fVar201 * auVar129._12_4_;
  auVar18 = vsubps_avx(auVar331,auVar247);
  auVar21 = vrcpss_avx(auVar165,auVar165);
  auVar15 = vfnmadd213ss_fma(auVar15,auVar21,SUB6416(ZEXT464(0x40000000),0));
  fVar77 = auVar21._0_4_ * auVar15._0_4_;
  fVar116 = auVar129._0_4_ * fVar185;
  fVar137 = auVar129._4_4_ * fVar185;
  fVar138 = auVar129._8_4_ * fVar185;
  fVar139 = auVar129._12_4_ * fVar185;
  auVar165 = vpermilps_avx(auVar93,0xc9);
  auVar15 = vdpps_avx(auVar165,auVar165,0x7f);
  auVar21 = vblendps_avx(auVar15,_DAT_01feba10,0xe);
  auVar129 = vrsqrtss_avx(auVar21,auVar21);
  fVar76 = auVar15._0_4_;
  fVar201 = auVar129._0_4_;
  auVar19 = vpermilps_avx(auVar94,0xc9);
  auVar129 = vdpps_avx(auVar165,auVar19,0x7f);
  fVar201 = fVar201 * 1.5 + fVar201 * fVar201 * fVar201 * fVar76 * -0.5;
  auVar289._0_4_ = fVar76 * auVar19._0_4_;
  auVar289._4_4_ = fVar76 * auVar19._4_4_;
  auVar289._8_4_ = fVar76 * auVar19._8_4_;
  auVar289._12_4_ = fVar76 * auVar19._12_4_;
  fVar76 = auVar129._0_4_;
  auVar85._0_4_ = fVar76 * auVar165._0_4_;
  auVar85._4_4_ = fVar76 * auVar165._4_4_;
  auVar85._8_4_ = fVar76 * auVar165._8_4_;
  auVar85._12_4_ = fVar76 * auVar165._12_4_;
  auVar129 = vsubps_avx(auVar289,auVar85);
  auVar21 = vrcpss_avx(auVar21,auVar21);
  auVar80 = SUB6416(ZEXT464(0x40000000),0);
  auVar15 = vfnmadd213ss_fma(auVar15,auVar21,auVar80);
  fVar76 = auVar21._0_4_ * auVar15._0_4_;
  fVar140 = auVar165._0_4_ * fVar201;
  fVar160 = auVar165._4_4_ * fVar201;
  fVar161 = auVar165._8_4_ * fVar201;
  fVar162 = auVar165._12_4_ * fVar201;
  auVar21 = vshufps_avx(auVar118,auVar118,0xff);
  auVar15 = vshufps_avx(auVar20,auVar20,0xff);
  auVar248._0_4_ = auVar15._0_4_ * fVar116;
  auVar248._4_4_ = auVar15._4_4_ * fVar137;
  auVar248._8_4_ = auVar15._8_4_ * fVar138;
  auVar248._12_4_ = auVar15._12_4_ * fVar139;
  auVar166._0_4_ = auVar21._0_4_ * fVar116 + fVar185 * auVar18._0_4_ * fVar77 * auVar15._0_4_;
  auVar166._4_4_ = auVar21._4_4_ * fVar137 + fVar185 * auVar18._4_4_ * fVar77 * auVar15._4_4_;
  auVar166._8_4_ = auVar21._8_4_ * fVar138 + fVar185 * auVar18._8_4_ * fVar77 * auVar15._8_4_;
  auVar166._12_4_ = auVar21._12_4_ * fVar139 + fVar185 * auVar18._12_4_ * fVar77 * auVar15._12_4_;
  auVar18 = vsubps_avx(auVar20,auVar248);
  local_4a8._0_4_ = auVar248._0_4_ + auVar20._0_4_;
  local_4a8._4_4_ = auVar248._4_4_ + auVar20._4_4_;
  fStack_4a0 = auVar248._8_4_ + auVar20._8_4_;
  fStack_49c = auVar248._12_4_ + auVar20._12_4_;
  auVar165 = vsubps_avx(auVar118,auVar166);
  auVar21 = vshufps_avx(auVar119,auVar119,0xff);
  auVar15 = vshufps_avx(auVar313,auVar313,0xff);
  auVar145._0_4_ = auVar15._0_4_ * fVar140;
  auVar145._4_4_ = auVar15._4_4_ * fVar160;
  auVar145._8_4_ = auVar15._8_4_ * fVar161;
  auVar145._12_4_ = auVar15._12_4_ * fVar162;
  auVar167._0_4_ = auVar21._0_4_ * fVar140 + auVar15._0_4_ * fVar201 * auVar129._0_4_ * fVar76;
  auVar167._4_4_ = auVar21._4_4_ * fVar160 + auVar15._4_4_ * fVar201 * auVar129._4_4_ * fVar76;
  auVar167._8_4_ = auVar21._8_4_ * fVar161 + auVar15._8_4_ * fVar201 * auVar129._8_4_ * fVar76;
  auVar167._12_4_ = auVar21._12_4_ * fVar162 + auVar15._12_4_ * fVar201 * auVar129._12_4_ * fVar76;
  auVar129 = vsubps_avx(auVar313,auVar145);
  local_4f8._4_4_ = auVar313._4_4_ + auVar145._4_4_;
  local_4f8._0_4_ = auVar313._0_4_ + auVar145._0_4_;
  fStack_4f0 = auVar313._8_4_ + auVar145._8_4_;
  fStack_4ec = auVar313._12_4_ + auVar145._12_4_;
  auVar19 = vsubps_avx(auVar119,auVar167);
  auVar86._8_4_ = 0x3e2aaaab;
  auVar86._0_8_ = 0x3e2aaaab3e2aaaab;
  auVar86._12_4_ = 0x3e2aaaab;
  local_358._0_4_ = auVar62._0_4_;
  local_358._4_4_ = auVar62._4_4_;
  fStack_350 = auVar62._8_4_;
  auVar314._0_4_ = (float)local_358._0_4_ * 0.16666667;
  auVar314._4_4_ = (float)local_358._4_4_ * 0.16666667;
  auVar314._8_4_ = fStack_350 * 0.16666667;
  auVar314._12_4_ = fVar141 * 0.16666667;
  auVar146._8_4_ = 0x3f2aaaab;
  auVar146._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar146._12_4_ = 0x3f2aaaab;
  auVar21 = vfmadd231ps_fma(auVar314,auVar146,auVar16);
  auVar15 = vfmadd231ps_fma(auVar81,auVar17,auVar146);
  auVar16 = vfmadd231ps_fma(auVar21,auVar17,auVar86);
  auVar20 = vfmadd231ps_fma(auVar15,auVar168,auVar86);
  auVar17 = vpermilps_avx(auVar175,0xc9);
  auVar21 = vdpps_avx(auVar17,auVar17,0x7f);
  auVar313 = vfmadd231ps_fma(auVar16,auVar168,ZEXT816(0) << 0x20);
  fVar201 = auVar21._0_4_;
  auVar168 = ZEXT416((uint)fVar201);
  auVar55._8_8_ = 0;
  auVar55._0_8_ = SUB648(ZEXT6064((undefined1  [60])0x0),4);
  auVar15 = vrsqrtss_avx(auVar168,auVar168);
  fVar185 = auVar15._0_4_;
  fVar185 = fVar201 * -0.5 * fVar185 * fVar185 * fVar185 + fVar185 * 1.5;
  auVar15 = vpermilps_avx(auVar127,0xc9);
  auVar277._0_4_ = fVar201 * auVar15._0_4_;
  auVar277._4_4_ = fVar201 * auVar15._4_4_;
  auVar277._8_4_ = fVar201 * auVar15._8_4_;
  auVar277._12_4_ = fVar201 * auVar15._12_4_;
  auVar15 = vdpps_avx(auVar17,auVar15,0x7f);
  fVar201 = auVar15._0_4_;
  auVar249._0_4_ = fVar201 * auVar17._0_4_;
  auVar249._4_4_ = fVar201 * auVar17._4_4_;
  auVar249._8_4_ = fVar201 * auVar17._8_4_;
  auVar249._12_4_ = fVar201 * auVar17._12_4_;
  auVar16 = vsubps_avx(auVar277,auVar249);
  auVar15 = vrcpss_avx(auVar168,auVar168);
  auVar21 = vfnmadd213ss_fma(auVar21,auVar15,auVar80);
  fVar77 = auVar15._0_4_ * auVar21._0_4_;
  fVar141 = auVar17._0_4_ * fVar185;
  fVar116 = auVar17._4_4_ * fVar185;
  fVar137 = auVar17._8_4_ * fVar185;
  fVar138 = auVar17._12_4_ * fVar185;
  auVar168 = vpermilps_avx(auVar100,0xc9);
  auVar21 = vdpps_avx(auVar168,auVar168,0x7f);
  fVar76 = auVar21._0_4_;
  auVar250._4_12_ = SUB1612(auVar55 << 0x40,4);
  auVar250._0_4_ = fVar76;
  auVar15 = vrsqrtss_avx(auVar250,auVar250);
  fVar201 = auVar15._0_4_;
  auVar17 = vpermilps_avx(auVar117,0xc9);
  auVar15 = vdpps_avx(auVar168,auVar17,0x7f);
  fVar201 = fVar201 * 1.5 + fVar76 * -0.5 * fVar201 * fVar201 * fVar201;
  auVar290._0_4_ = fVar76 * auVar17._0_4_;
  auVar290._4_4_ = fVar76 * auVar17._4_4_;
  auVar290._8_4_ = fVar76 * auVar17._8_4_;
  auVar290._12_4_ = fVar76 * auVar17._12_4_;
  fVar76 = auVar15._0_4_;
  auVar325._0_4_ = fVar76 * auVar168._0_4_;
  auVar325._4_4_ = fVar76 * auVar168._4_4_;
  auVar325._8_4_ = fVar76 * auVar168._8_4_;
  auVar325._12_4_ = fVar76 * auVar168._12_4_;
  auVar17 = vsubps_avx(auVar290,auVar325);
  auVar15 = vrcpss_avx(auVar250,auVar250);
  auVar21 = vfnmadd213ss_fma(auVar21,auVar15,auVar80);
  fVar76 = auVar15._0_4_ * auVar21._0_4_;
  fVar139 = fVar201 * auVar168._0_4_;
  fVar140 = fVar201 * auVar168._4_4_;
  fVar160 = fVar201 * auVar168._8_4_;
  fVar161 = fVar201 * auVar168._12_4_;
  auVar21 = vshufps_avx(auVar163,auVar163,0xff);
  auVar15 = vshufps_avx(auVar20,auVar20,0xff);
  auVar147._0_4_ = auVar15._0_4_ * fVar141;
  auVar147._4_4_ = auVar15._4_4_ * fVar116;
  auVar147._8_4_ = auVar15._8_4_ * fVar137;
  auVar147._12_4_ = auVar15._12_4_ * fVar138;
  auVar103._0_4_ = auVar21._0_4_ * fVar141 + auVar15._0_4_ * fVar185 * auVar16._0_4_ * fVar77;
  auVar103._4_4_ = auVar21._4_4_ * fVar116 + auVar15._4_4_ * fVar185 * auVar16._4_4_ * fVar77;
  auVar103._8_4_ = auVar21._8_4_ * fVar137 + auVar15._8_4_ * fVar185 * auVar16._8_4_ * fVar77;
  auVar103._12_4_ = auVar21._12_4_ * fVar138 + auVar15._12_4_ * fVar185 * auVar16._12_4_ * fVar77;
  auVar16 = vsubps_avx(auVar20,auVar147);
  fVar77 = auVar20._0_4_ + auVar147._0_4_;
  fVar141 = auVar20._4_4_ + auVar147._4_4_;
  fVar116 = auVar20._8_4_ + auVar147._8_4_;
  fVar137 = auVar20._12_4_ + auVar147._12_4_;
  auVar168 = vsubps_avx(auVar163,auVar103);
  auVar21 = vshufps_avx(auVar186,auVar186,0xff);
  auVar15 = vshufps_avx(auVar313,auVar313,0xff);
  auVar169._0_4_ = auVar15._0_4_ * fVar139;
  auVar169._4_4_ = auVar15._4_4_ * fVar140;
  auVar169._8_4_ = auVar15._8_4_ * fVar160;
  auVar169._12_4_ = auVar15._12_4_ * fVar161;
  auVar104._0_4_ = auVar15._0_4_ * fVar201 * auVar17._0_4_ * fVar76 + auVar21._0_4_ * fVar139;
  auVar104._4_4_ = auVar15._4_4_ * fVar201 * auVar17._4_4_ * fVar76 + auVar21._4_4_ * fVar140;
  auVar104._8_4_ = auVar15._8_4_ * fVar201 * auVar17._8_4_ * fVar76 + auVar21._8_4_ * fVar160;
  auVar104._12_4_ = auVar15._12_4_ * fVar201 * auVar17._12_4_ * fVar76 + auVar21._12_4_ * fVar161;
  auVar21 = vsubps_avx(auVar313,auVar169);
  auVar170._0_4_ = auVar313._0_4_ + auVar169._0_4_;
  auVar170._4_4_ = auVar313._4_4_ + auVar169._4_4_;
  auVar170._8_4_ = auVar313._8_4_ + auVar169._8_4_;
  auVar170._12_4_ = auVar313._12_4_ + auVar169._12_4_;
  auVar15 = vsubps_avx(auVar186,auVar104);
  local_4e8._0_4_ = auVar165._0_4_;
  local_4e8._4_4_ = auVar165._4_4_;
  uStack_4e0._0_4_ = auVar165._8_4_;
  uStack_4e0._4_4_ = auVar165._12_4_;
  auVar191._0_4_ = auVar18._0_4_ + (float)local_4e8._0_4_ * 0.33333334;
  auVar191._4_4_ = auVar18._4_4_ + (float)local_4e8._4_4_ * 0.33333334;
  auVar191._8_4_ = auVar18._8_4_ + (float)uStack_4e0 * 0.33333334;
  auVar191._12_4_ = auVar18._12_4_ + uStack_4e0._4_4_ * 0.33333334;
  fVar185 = 1.0 - fVar202;
  auVar105._4_4_ = fVar185;
  auVar105._0_4_ = fVar185;
  auVar105._8_4_ = fVar185;
  auVar105._12_4_ = fVar185;
  auVar291._0_4_ = fVar202 * auVar16._0_4_;
  auVar291._4_4_ = fVar202 * auVar16._4_4_;
  auVar291._8_4_ = fVar202 * auVar16._8_4_;
  auVar291._12_4_ = fVar202 * auVar16._12_4_;
  local_378 = vfmadd231ps_fma(auVar291,auVar105,auVar18);
  auVar120._0_4_ = fVar202 * (auVar16._0_4_ + auVar168._0_4_ * 0.33333334);
  auVar120._4_4_ = fVar202 * (auVar16._4_4_ + auVar168._4_4_ * 0.33333334);
  auVar120._8_4_ = fVar202 * (auVar16._8_4_ + auVar168._8_4_ * 0.33333334);
  auVar120._12_4_ = fVar202 * (auVar16._12_4_ + auVar168._12_4_ * 0.33333334);
  local_388 = vfmadd231ps_fma(auVar120,auVar105,auVar191);
  local_4b8 = auVar19._0_4_;
  fStack_4b4 = auVar19._4_4_;
  fStack_4b0 = auVar19._8_4_;
  fStack_4ac = auVar19._12_4_;
  auVar121._0_4_ = local_4b8 * 0.33333334;
  auVar121._4_4_ = fStack_4b4 * 0.33333334;
  auVar121._8_4_ = fStack_4b0 * 0.33333334;
  auVar121._12_4_ = fStack_4ac * 0.33333334;
  auVar16 = vsubps_avx(auVar129,auVar121);
  local_518._4_4_ = (float)local_4a8._4_4_ + (fVar244 + auVar166._4_4_) * 0.33333334;
  local_518._0_4_ = (float)local_4a8._0_4_ + (fVar227 + auVar166._0_4_) * 0.33333334;
  fStack_510 = fStack_4a0 + (fVar262 + auVar166._8_4_) * 0.33333334;
  fStack_50c = fStack_49c + (fVar273 + auVar166._12_4_) * 0.33333334;
  auVar208._0_4_ = (fVar274 + auVar167._0_4_) * 0.33333334;
  auVar208._4_4_ = (fVar285 + auVar167._4_4_) * 0.33333334;
  auVar208._8_4_ = (fVar311 + auVar167._8_4_) * 0.33333334;
  auVar208._12_4_ = (fVar312 + auVar167._12_4_) * 0.33333334;
  auVar17 = vsubps_avx(_local_4f8,auVar208);
  auVar292._0_4_ = auVar15._0_4_ * 0.33333334;
  auVar292._4_4_ = auVar15._4_4_ * 0.33333334;
  auVar292._8_4_ = auVar15._8_4_ * 0.33333334;
  auVar292._12_4_ = auVar15._12_4_ * 0.33333334;
  auVar15 = vsubps_avx(auVar21,auVar292);
  auVar266._0_4_ = (fVar221 + auVar104._0_4_) * 0.33333334;
  auVar266._4_4_ = (fVar286 + auVar104._4_4_) * 0.33333334;
  auVar266._8_4_ = (fVar222 + auVar104._8_4_) * 0.33333334;
  auVar266._12_4_ = (fVar287 + auVar104._12_4_) * 0.33333334;
  auVar168 = vsubps_avx(auVar170,auVar266);
  auVar293._0_4_ = fVar202 * auVar15._0_4_;
  auVar293._4_4_ = fVar202 * auVar15._4_4_;
  auVar293._8_4_ = fVar202 * auVar15._8_4_;
  auVar293._12_4_ = fVar202 * auVar15._12_4_;
  auVar302._0_4_ = fVar202 * auVar21._0_4_;
  auVar302._4_4_ = fVar202 * auVar21._4_4_;
  auVar302._8_4_ = fVar202 * auVar21._8_4_;
  auVar302._12_4_ = fVar202 * auVar21._12_4_;
  local_398 = vfmadd231ps_fma(auVar293,auVar105,auVar16);
  local_3a8 = vfmadd231ps_fma(auVar302,auVar105,auVar129);
  auVar122._0_4_ = fVar202 * fVar77;
  auVar122._4_4_ = fVar202 * fVar141;
  auVar122._8_4_ = fVar202 * fVar116;
  auVar122._12_4_ = fVar202 * fVar137;
  auVar148._0_4_ = fVar202 * (fVar77 + (fVar223 + auVar103._0_4_) * 0.33333334);
  auVar148._4_4_ = fVar202 * (fVar141 + (fVar224 + auVar103._4_4_) * 0.33333334);
  auVar148._8_4_ = fVar202 * (fVar116 + (fVar225 + auVar103._8_4_) * 0.33333334);
  auVar148._12_4_ = fVar202 * (fVar137 + (fVar226 + auVar103._12_4_) * 0.33333334);
  auVar230._0_4_ = fVar202 * auVar168._0_4_;
  auVar230._4_4_ = fVar202 * auVar168._4_4_;
  auVar230._8_4_ = fVar202 * auVar168._8_4_;
  auVar230._12_4_ = fVar202 * auVar168._12_4_;
  auVar171._0_4_ = fVar202 * auVar170._0_4_;
  auVar171._4_4_ = fVar202 * auVar170._4_4_;
  auVar171._8_4_ = fVar202 * auVar170._8_4_;
  auVar171._12_4_ = fVar202 * auVar170._12_4_;
  _local_3b8 = vfmadd231ps_fma(auVar122,auVar105,_local_4a8);
  _local_408 = vfmadd231ps_fma(auVar148,auVar105,_local_518);
  _local_418 = vfmadd231ps_fma(auVar230,auVar105,auVar17);
  _local_428 = vfmadd231ps_fma(auVar171,auVar105,_local_4f8);
  aVar5 = (ray->org).field_0;
  auVar129 = vsubps_avx(local_378,(undefined1  [16])aVar5);
  auVar21 = vshufps_avx(auVar129,auVar129,0x55);
  auVar15 = vshufps_avx(auVar129,auVar129,0xaa);
  aVar6 = (pre->ray_space).vy.field_0;
  fVar185 = (pre->ray_space).vz.field_0.m128[0];
  fVar201 = (pre->ray_space).vz.field_0.m128[1];
  fVar202 = (pre->ray_space).vz.field_0.m128[2];
  fVar77 = (pre->ray_space).vz.field_0.m128[3];
  auVar172._0_4_ = fVar185 * auVar15._0_4_;
  auVar172._4_4_ = fVar201 * auVar15._4_4_;
  auVar172._8_4_ = fVar202 * auVar15._8_4_;
  auVar172._12_4_ = fVar77 * auVar15._12_4_;
  auVar20 = vfmadd231ps_fma(auVar172,(undefined1  [16])aVar6,auVar21);
  auVar16 = vsubps_avx(local_388,(undefined1  [16])aVar5);
  auVar21 = vshufps_avx(auVar16,auVar16,0x55);
  auVar15 = vshufps_avx(auVar16,auVar16,0xaa);
  auVar106._0_4_ = fVar185 * auVar15._0_4_;
  auVar106._4_4_ = fVar201 * auVar15._4_4_;
  auVar106._8_4_ = fVar202 * auVar15._8_4_;
  auVar106._12_4_ = fVar77 * auVar15._12_4_;
  auVar313 = vfmadd231ps_fma(auVar106,(undefined1  [16])aVar6,auVar21);
  auVar15 = vsubps_avx(local_398,(undefined1  [16])aVar5);
  auVar21 = vshufps_avx(auVar15,auVar15,0xaa);
  auVar123._0_4_ = fVar185 * auVar21._0_4_;
  auVar123._4_4_ = fVar201 * auVar21._4_4_;
  auVar123._8_4_ = fVar202 * auVar21._8_4_;
  auVar123._12_4_ = fVar77 * auVar21._12_4_;
  auVar21 = vshufps_avx(auVar15,auVar15,0x55);
  auVar127 = vfmadd231ps_fma(auVar123,(undefined1  [16])aVar6,auVar21);
  auVar17 = vsubps_avx(local_3a8,(undefined1  [16])aVar5);
  auVar21 = vshufps_avx(auVar17,auVar17,0xaa);
  auVar149._0_4_ = fVar185 * auVar21._0_4_;
  auVar149._4_4_ = fVar201 * auVar21._4_4_;
  auVar149._8_4_ = fVar202 * auVar21._8_4_;
  auVar149._12_4_ = fVar77 * auVar21._12_4_;
  auVar21 = vshufps_avx(auVar17,auVar17,0x55);
  auVar80 = vfmadd231ps_fma(auVar149,(undefined1  [16])aVar6,auVar21);
  auVar168 = vsubps_avx(_local_3b8,(undefined1  [16])aVar5);
  auVar21 = vshufps_avx(auVar168,auVar168,0xaa);
  auVar192._0_4_ = fVar185 * auVar21._0_4_;
  auVar192._4_4_ = fVar201 * auVar21._4_4_;
  auVar192._8_4_ = fVar202 * auVar21._8_4_;
  auVar192._12_4_ = fVar77 * auVar21._12_4_;
  auVar21 = vshufps_avx(auVar168,auVar168,0x55);
  auVar81 = vfmadd231ps_fma(auVar192,(undefined1  [16])aVar6,auVar21);
  auVar18 = vsubps_avx(_local_408,(undefined1  [16])aVar5);
  auVar21 = vshufps_avx(auVar18,auVar18,0xaa);
  auVar267._0_4_ = fVar185 * auVar21._0_4_;
  auVar267._4_4_ = fVar201 * auVar21._4_4_;
  auVar267._8_4_ = fVar202 * auVar21._8_4_;
  auVar267._12_4_ = fVar77 * auVar21._12_4_;
  auVar21 = vshufps_avx(auVar18,auVar18,0x55);
  auVar253 = vfmadd231ps_fma(auVar267,(undefined1  [16])aVar6,auVar21);
  auVar165 = vsubps_avx(_local_418,(undefined1  [16])aVar5);
  auVar21 = vshufps_avx(auVar165,auVar165,0xaa);
  auVar303._0_4_ = fVar185 * auVar21._0_4_;
  auVar303._4_4_ = fVar201 * auVar21._4_4_;
  auVar303._8_4_ = fVar202 * auVar21._8_4_;
  auVar303._12_4_ = fVar77 * auVar21._12_4_;
  auVar21 = vshufps_avx(auVar165,auVar165,0x55);
  auVar79 = vfmadd231ps_fma(auVar303,(undefined1  [16])aVar6,auVar21);
  auVar19 = vsubps_avx(_local_428,(undefined1  [16])aVar5);
  auVar21 = vshufps_avx(auVar19,auVar19,0xaa);
  auVar231._0_4_ = fVar185 * auVar21._0_4_;
  auVar231._4_4_ = fVar201 * auVar21._4_4_;
  auVar231._8_4_ = fVar202 * auVar21._8_4_;
  auVar231._12_4_ = fVar77 * auVar21._12_4_;
  auVar21 = vshufps_avx(auVar19,auVar19,0x55);
  auVar21 = vfmadd231ps_fma(auVar231,(undefined1  [16])aVar6,auVar21);
  local_518._0_4_ = auVar129._0_4_;
  auVar209._4_4_ = local_518._0_4_;
  auVar209._0_4_ = local_518._0_4_;
  auVar209._8_4_ = local_518._0_4_;
  auVar209._12_4_ = local_518._0_4_;
  aVar6 = (pre->ray_space).vx.field_0;
  auVar20 = vfmadd231ps_fma(auVar20,(undefined1  [16])aVar6,auVar209);
  local_4a8._0_4_ = auVar16._0_4_;
  auVar210._4_4_ = local_4a8._0_4_;
  auVar210._0_4_ = local_4a8._0_4_;
  auVar210._8_4_ = local_4a8._0_4_;
  auVar210._12_4_ = local_4a8._0_4_;
  auVar313 = vfmadd231ps_fma(auVar313,(undefined1  [16])aVar6,auVar210);
  uVar78 = auVar15._0_4_;
  auVar211._4_4_ = uVar78;
  auVar211._0_4_ = uVar78;
  auVar211._8_4_ = uVar78;
  auVar211._12_4_ = uVar78;
  auVar127 = vfmadd231ps_fma(auVar127,(undefined1  [16])aVar6,auVar211);
  uVar78 = auVar17._0_4_;
  auVar212._4_4_ = uVar78;
  auVar212._0_4_ = uVar78;
  auVar212._8_4_ = uVar78;
  auVar212._12_4_ = uVar78;
  auVar80 = vfmadd231ps_fma(auVar80,(undefined1  [16])aVar6,auVar212);
  uVar78 = auVar168._0_4_;
  auVar213._4_4_ = uVar78;
  auVar213._0_4_ = uVar78;
  auVar213._8_4_ = uVar78;
  auVar213._12_4_ = uVar78;
  auVar81 = vfmadd231ps_fma(auVar81,(undefined1  [16])aVar6,auVar213);
  uVar78 = auVar18._0_4_;
  auVar214._4_4_ = uVar78;
  auVar214._0_4_ = uVar78;
  auVar214._8_4_ = uVar78;
  auVar214._12_4_ = uVar78;
  auVar18 = vfmadd231ps_fma(auVar253,(undefined1  [16])aVar6,auVar214);
  auVar87._0_4_ = auVar165._0_4_;
  auVar87._4_4_ = auVar87._0_4_;
  auVar87._8_4_ = auVar87._0_4_;
  auVar87._12_4_ = auVar87._0_4_;
  auVar165 = vfmadd231ps_fma(auVar79,(undefined1  [16])aVar6,auVar87);
  uVar78 = auVar19._0_4_;
  auVar88._4_4_ = uVar78;
  auVar88._0_4_ = uVar78;
  auVar88._8_4_ = uVar78;
  auVar88._12_4_ = uVar78;
  auVar19 = vfmadd231ps_fma(auVar21,(undefined1  [16])aVar6,auVar88);
  auVar16 = vmovlhps_avx(auVar20,auVar81);
  auVar17 = vmovlhps_avx(auVar313,auVar18);
  auVar168 = vmovlhps_avx(auVar127,auVar165);
  _local_2b8 = vmovlhps_avx(auVar80,auVar19);
  auVar329 = ZEXT1664(_local_2b8);
  auVar21 = vminps_avx(auVar16,auVar17);
  auVar15 = vminps_avx(auVar168,_local_2b8);
  auVar129 = vminps_avx(auVar21,auVar15);
  auVar21 = vmaxps_avx(auVar16,auVar17);
  auVar15 = vmaxps_avx(auVar168,_local_2b8);
  auVar21 = vmaxps_avx(auVar21,auVar15);
  auVar15 = vshufpd_avx(auVar129,auVar129,3);
  auVar129 = vminps_avx(auVar129,auVar15);
  auVar15 = vshufpd_avx(auVar21,auVar21,3);
  auVar15 = vmaxps_avx(auVar21,auVar15);
  auVar21 = vandps_avx(local_328,auVar129);
  auVar15 = vandps_avx(local_328,auVar15);
  auVar21 = vmaxps_avx(auVar21,auVar15);
  auVar15 = vmovshdup_avx(auVar21);
  auVar21 = vmaxss_avx(auVar15,auVar21);
  auVar75 = (undefined1  [8])((ulong)uVar63 + 0xf);
  local_178 = auVar21._0_4_ * 9.536743e-07;
  local_3c8._0_8_ = auVar20._0_8_;
  local_3c8._8_8_ = local_3c8._0_8_;
  local_3d8._8_8_ = auVar313._0_8_;
  local_3d8._0_8_ = auVar313._0_8_;
  local_3e8._8_8_ = auVar127._0_8_;
  local_3e8._0_8_ = auVar127._0_8_;
  local_3f8._8_8_ = auVar80._0_8_;
  local_3f8._0_8_ = auVar80._0_8_;
  local_1e8 = ZEXT416((uint)local_178);
  fStack_174 = local_178;
  fStack_170 = local_178;
  fStack_16c = local_178;
  fStack_168 = local_178;
  fStack_164 = local_178;
  fStack_160 = local_178;
  fStack_15c = local_178;
  local_198 = (uint)local_178 ^ local_368;
  uStack_194 = local_198;
  uStack_190 = local_198;
  uStack_18c = local_198;
  uStack_188 = local_198;
  uStack_184 = local_198;
  uStack_180 = local_198;
  uStack_17c = local_198;
  uVar73 = 0;
  uVar67 = 0;
  local_338 = vsubps_avx(auVar17,auVar16);
  local_348 = vsubps_avx(auVar168,auVar17);
  _local_358 = vsubps_avx(_local_2b8,auVar168);
  local_218 = vsubps_avx(_local_3b8,local_378);
  local_228 = vsubps_avx(_local_408,local_388);
  local_238 = vsubps_avx(_local_418,local_398);
  _local_248 = vsubps_avx(_local_428,local_3a8);
  _local_518 = ZEXT816(0x3f80000000000000);
  local_1f8 = _local_518;
  do {
    auVar21 = vshufps_avx(_local_518,_local_518,0x50);
    auVar150._8_4_ = 0x3f800000;
    auVar150._0_8_ = &DAT_3f8000003f800000;
    auVar150._12_4_ = 0x3f800000;
    auVar157._16_4_ = 0x3f800000;
    auVar157._0_16_ = auVar150;
    auVar157._20_4_ = 0x3f800000;
    auVar157._24_4_ = 0x3f800000;
    auVar157._28_4_ = 0x3f800000;
    auVar15 = vsubps_avx(auVar150,auVar21);
    fVar185 = auVar21._0_4_;
    fVar311 = auVar81._0_4_;
    auVar89._0_4_ = fVar311 * fVar185;
    fVar201 = auVar21._4_4_;
    fVar312 = auVar81._4_4_;
    auVar89._4_4_ = fVar312 * fVar201;
    fVar202 = auVar21._8_4_;
    auVar89._8_4_ = fVar311 * fVar202;
    fVar77 = auVar21._12_4_;
    auVar89._12_4_ = fVar312 * fVar77;
    fVar227 = auVar18._0_4_;
    auVar193._0_4_ = fVar227 * fVar185;
    fVar244 = auVar18._4_4_;
    auVar193._4_4_ = fVar244 * fVar201;
    auVar193._8_4_ = fVar227 * fVar202;
    auVar193._12_4_ = fVar244 * fVar77;
    fVar262 = auVar165._0_4_;
    auVar232._0_4_ = fVar262 * fVar185;
    fVar273 = auVar165._4_4_;
    auVar232._4_4_ = fVar273 * fVar201;
    auVar232._8_4_ = fVar262 * fVar202;
    auVar232._12_4_ = fVar273 * fVar77;
    fVar274 = auVar19._0_4_;
    auVar278._0_4_ = fVar274 * fVar185;
    fVar285 = auVar19._4_4_;
    auVar278._4_4_ = fVar285 * fVar201;
    auVar278._8_4_ = fVar274 * fVar202;
    auVar278._12_4_ = fVar285 * fVar77;
    auVar313 = vfmadd231ps_fma(auVar89,auVar15,local_3c8);
    auVar127 = vfmadd231ps_fma(auVar193,auVar15,local_3d8);
    auVar80 = vfmadd231ps_fma(auVar232,auVar15,local_3e8);
    auVar253 = vfmadd231ps_fma(auVar278,local_3f8,auVar15);
    local_448 = auVar253._0_4_;
    auVar21 = vmovshdup_avx(local_1f8);
    fVar185 = local_1f8._0_4_;
    fVar76 = (auVar21._0_4_ - fVar185) * 0.04761905;
    auVar261._4_4_ = fVar185;
    auVar261._0_4_ = fVar185;
    auVar261._8_4_ = fVar185;
    auVar261._12_4_ = fVar185;
    auVar261._16_4_ = fVar185;
    auVar261._20_4_ = fVar185;
    auVar261._24_4_ = fVar185;
    auVar261._28_4_ = fVar185;
    auVar134._0_8_ = auVar21._0_8_;
    auVar134._8_8_ = auVar134._0_8_;
    auVar134._16_8_ = auVar134._0_8_;
    auVar134._24_8_ = auVar134._0_8_;
    auVar92 = vsubps_avx(auVar134,auVar261);
    uVar78 = auVar313._0_4_;
    auVar335._4_4_ = uVar78;
    auVar335._0_4_ = uVar78;
    auVar335._8_4_ = uVar78;
    auVar335._12_4_ = uVar78;
    auVar335._16_4_ = uVar78;
    auVar335._20_4_ = uVar78;
    auVar335._24_4_ = uVar78;
    auVar335._28_4_ = uVar78;
    auVar21 = vmovshdup_avx(auVar313);
    uVar203 = auVar21._0_8_;
    auVar321._8_8_ = uVar203;
    auVar321._0_8_ = uVar203;
    auVar321._16_8_ = uVar203;
    auVar321._24_8_ = uVar203;
    fVar141 = auVar127._0_4_;
    auVar114._4_4_ = fVar141;
    auVar114._0_4_ = fVar141;
    auVar114._8_4_ = fVar141;
    auVar114._12_4_ = fVar141;
    auVar114._16_4_ = fVar141;
    auVar114._20_4_ = fVar141;
    auVar114._24_4_ = fVar141;
    auVar114._28_4_ = fVar141;
    auVar15 = vmovshdup_avx(auVar127);
    auVar218._0_8_ = auVar15._0_8_;
    auVar218._8_8_ = auVar218._0_8_;
    auVar218._16_8_ = auVar218._0_8_;
    auVar218._24_8_ = auVar218._0_8_;
    fVar138 = auVar80._0_4_;
    auVar300._4_4_ = fVar138;
    auVar300._0_4_ = fVar138;
    auVar300._8_4_ = fVar138;
    auVar300._12_4_ = fVar138;
    auVar300._16_4_ = fVar138;
    auVar300._20_4_ = fVar138;
    auVar300._24_4_ = fVar138;
    auVar300._28_4_ = fVar138;
    auVar129 = vmovshdup_avx(auVar80);
    auVar272._0_8_ = auVar129._0_8_;
    auVar272._8_8_ = auVar272._0_8_;
    auVar272._16_8_ = auVar272._0_8_;
    auVar272._24_8_ = auVar272._0_8_;
    auVar20 = vmovshdup_avx(auVar253);
    auVar79 = vfmadd132ps_fma(auVar92,auVar261,_DAT_02020f20);
    auVar92 = vsubps_avx(auVar157,ZEXT1632(auVar79));
    fVar185 = auVar79._0_4_;
    auVar330._0_4_ = fVar141 * fVar185;
    fVar201 = auVar79._4_4_;
    auVar330._4_4_ = fVar141 * fVar201;
    fVar202 = auVar79._8_4_;
    auVar330._8_4_ = fVar141 * fVar202;
    fVar77 = auVar79._12_4_;
    auVar330._12_4_ = fVar141 * fVar77;
    auVar330._16_4_ = fVar141 * 0.0;
    auVar330._20_4_ = fVar141 * 0.0;
    auVar330._28_36_ = auVar329._28_36_;
    auVar330._24_4_ = fVar141 * 0.0;
    auVar79 = vfmadd231ps_fma(auVar330._0_32_,auVar92,auVar335);
    fVar116 = auVar15._0_4_;
    fVar137 = auVar15._4_4_;
    auVar22._4_4_ = fVar137 * fVar201;
    auVar22._0_4_ = fVar116 * fVar185;
    auVar22._8_4_ = fVar116 * fVar202;
    auVar22._12_4_ = fVar137 * fVar77;
    auVar22._16_4_ = fVar116 * 0.0;
    auVar22._20_4_ = fVar137 * 0.0;
    auVar22._24_4_ = fVar116 * 0.0;
    auVar22._28_4_ = local_448;
    auVar93 = vfmadd231ps_fma(auVar22,auVar92,auVar321);
    auVar23._4_4_ = fVar138 * fVar201;
    auVar23._0_4_ = fVar138 * fVar185;
    auVar23._8_4_ = fVar138 * fVar202;
    auVar23._12_4_ = fVar138 * fVar77;
    auVar23._16_4_ = fVar138 * 0.0;
    auVar23._20_4_ = fVar138 * 0.0;
    auVar23._24_4_ = fVar138 * 0.0;
    auVar23._28_4_ = auVar21._4_4_;
    auVar94 = vfmadd231ps_fma(auVar23,auVar92,auVar114);
    fVar116 = auVar129._0_4_;
    fVar137 = auVar129._4_4_;
    auVar24._4_4_ = fVar137 * fVar201;
    auVar24._0_4_ = fVar116 * fVar185;
    auVar24._8_4_ = fVar116 * fVar202;
    auVar24._12_4_ = fVar137 * fVar77;
    auVar24._16_4_ = fVar116 * 0.0;
    auVar24._20_4_ = fVar137 * 0.0;
    auVar24._24_4_ = fVar116 * 0.0;
    auVar24._28_4_ = uVar78;
    auVar175 = vfmadd231ps_fma(auVar24,auVar92,auVar218);
    auVar21 = vshufps_avx(auVar313,auVar313,0xaa);
    auVar219._0_8_ = auVar21._0_8_;
    auVar219._8_8_ = auVar219._0_8_;
    auVar219._16_8_ = auVar219._0_8_;
    auVar219._24_8_ = auVar219._0_8_;
    auVar15 = vshufps_avx(auVar313,auVar313,0xff);
    uStack_4e0 = auVar15._0_8_;
    local_4e8 = (undefined1  [8])uStack_4e0;
    uStack_4d8 = uStack_4e0;
    uStack_4d0 = uStack_4e0;
    auVar25._4_4_ = fVar201 * local_448;
    auVar25._0_4_ = fVar185 * local_448;
    auVar25._8_4_ = fVar202 * local_448;
    auVar25._12_4_ = fVar77 * local_448;
    auVar25._16_4_ = local_448 * 0.0;
    auVar25._20_4_ = local_448 * 0.0;
    auVar25._24_4_ = local_448 * 0.0;
    auVar25._28_4_ = 0x3f800000;
    auVar100 = vfmadd231ps_fma(auVar25,auVar92,auVar300);
    auVar129 = vshufps_avx(auVar127,auVar127,0xaa);
    auVar183._0_8_ = auVar129._0_8_;
    auVar183._8_8_ = auVar183._0_8_;
    auVar183._16_8_ = auVar183._0_8_;
    auVar183._24_8_ = auVar183._0_8_;
    auVar313 = vshufps_avx(auVar127,auVar127,0xff);
    auVar200._0_8_ = auVar313._0_8_;
    auVar200._8_8_ = auVar200._0_8_;
    auVar200._16_8_ = auVar200._0_8_;
    auVar200._24_8_ = auVar200._0_8_;
    fVar116 = auVar20._0_4_;
    fVar137 = auVar20._4_4_;
    auVar26._4_4_ = fVar137 * fVar201;
    auVar26._0_4_ = fVar116 * fVar185;
    auVar26._8_4_ = fVar116 * fVar202;
    auVar26._12_4_ = fVar137 * fVar77;
    auVar26._16_4_ = fVar116 * 0.0;
    auVar26._20_4_ = fVar137 * 0.0;
    auVar26._24_4_ = fVar116 * 0.0;
    auVar26._28_4_ = fVar138;
    auVar117 = vfmadd231ps_fma(auVar26,auVar92,auVar272);
    auVar27._28_4_ = fVar141;
    auVar27._0_28_ =
         ZEXT1628(CONCAT412(auVar94._12_4_ * fVar77,
                            CONCAT48(auVar94._8_4_ * fVar202,
                                     CONCAT44(auVar94._4_4_ * fVar201,auVar94._0_4_ * fVar185))));
    auVar79 = vfmadd231ps_fma(auVar27,auVar92,ZEXT1632(auVar79));
    auVar310._28_4_ = auVar15._4_4_;
    auVar310._0_28_ =
         ZEXT1628(CONCAT412(auVar175._12_4_ * fVar77,
                            CONCAT48(auVar175._8_4_ * fVar202,
                                     CONCAT44(auVar175._4_4_ * fVar201,auVar175._0_4_ * fVar185))));
    auVar93 = vfmadd231ps_fma(auVar310,auVar92,ZEXT1632(auVar93));
    auVar15 = vshufps_avx(auVar80,auVar80,0xaa);
    uVar203 = auVar15._0_8_;
    auVar309._8_8_ = uVar203;
    auVar309._0_8_ = uVar203;
    auVar309._16_8_ = uVar203;
    auVar309._24_8_ = uVar203;
    auVar20 = vshufps_avx(auVar80,auVar80,0xff);
    uVar203 = auVar20._0_8_;
    auVar327._8_8_ = uVar203;
    auVar327._0_8_ = uVar203;
    auVar327._16_8_ = uVar203;
    auVar327._24_8_ = uVar203;
    auVar94 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar77 * auVar100._12_4_,
                                                 CONCAT48(fVar202 * auVar100._8_4_,
                                                          CONCAT44(fVar201 * auVar100._4_4_,
                                                                   fVar185 * auVar100._0_4_)))),
                              auVar92,ZEXT1632(auVar94));
    auVar127 = vshufps_avx(auVar253,auVar253,0xaa);
    auVar80 = vshufps_avx(auVar253,auVar253,0xff);
    local_448 = auVar80._0_4_;
    fStack_444 = auVar80._4_4_;
    auVar29._28_4_ = fStack_444;
    auVar29._0_28_ =
         ZEXT1628(CONCAT412(auVar117._12_4_ * fVar77,
                            CONCAT48(auVar117._8_4_ * fVar202,
                                     CONCAT44(auVar117._4_4_ * fVar201,auVar117._0_4_ * fVar185))));
    auVar80 = vfmadd231ps_fma(auVar29,auVar92,ZEXT1632(auVar175));
    auVar253 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar77 * auVar94._12_4_,
                                                  CONCAT48(fVar202 * auVar94._8_4_,
                                                           CONCAT44(fVar201 * auVar94._4_4_,
                                                                    fVar185 * auVar94._0_4_)))),
                               auVar92,ZEXT1632(auVar79));
    auVar22 = vsubps_avx(ZEXT1632(auVar94),ZEXT1632(auVar79));
    auVar79 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar77 * auVar80._12_4_,
                                                 CONCAT48(fVar202 * auVar80._8_4_,
                                                          CONCAT44(fVar201 * auVar80._4_4_,
                                                                   fVar185 * auVar80._0_4_)))),
                              auVar92,ZEXT1632(auVar93));
    auVar23 = vsubps_avx(ZEXT1632(auVar80),ZEXT1632(auVar93));
    fVar160 = fVar76 * auVar22._0_4_ * 3.0;
    fVar162 = fVar76 * auVar22._4_4_ * 3.0;
    auVar30._4_4_ = fVar162;
    auVar30._0_4_ = fVar160;
    fVar286 = fVar76 * auVar22._8_4_ * 3.0;
    auVar30._8_4_ = fVar286;
    fVar287 = fVar76 * auVar22._12_4_ * 3.0;
    auVar30._12_4_ = fVar287;
    fStack_438 = fVar76 * auVar22._16_4_ * 3.0;
    auVar30._16_4_ = fStack_438;
    fStack_434 = fVar76 * auVar22._20_4_ * 3.0;
    auVar30._20_4_ = fStack_434;
    fStack_430 = fVar76 * auVar22._24_4_ * 3.0;
    auVar30._24_4_ = fStack_430;
    auVar30._28_4_ = 0x40400000;
    local_468._0_4_ = fVar76 * auVar23._0_4_ * 3.0;
    local_468._4_4_ = fVar76 * auVar23._4_4_ * 3.0;
    fStack_460 = fVar76 * auVar23._8_4_ * 3.0;
    fStack_45c = fVar76 * auVar23._12_4_ * 3.0;
    fStack_458 = fVar76 * auVar23._16_4_ * 3.0;
    fStack_454 = fVar76 * auVar23._20_4_ * 3.0;
    fStack_450 = fVar76 * auVar23._24_4_ * 3.0;
    fStack_44c = auVar23._28_4_;
    fVar141 = auVar129._0_4_;
    fVar116 = auVar129._4_4_;
    auVar31._4_4_ = fVar116 * fVar201;
    auVar31._0_4_ = fVar141 * fVar185;
    auVar31._8_4_ = fVar141 * fVar202;
    auVar31._12_4_ = fVar116 * fVar77;
    auVar31._16_4_ = fVar141 * 0.0;
    auVar31._20_4_ = fVar116 * 0.0;
    auVar31._24_4_ = fVar141 * 0.0;
    auVar31._28_4_ = auVar22._28_4_;
    auVar129 = vfmadd231ps_fma(auVar31,auVar92,auVar219);
    fVar141 = auVar313._0_4_;
    fVar137 = auVar313._4_4_;
    auVar32._4_4_ = fVar137 * fVar201;
    auVar32._0_4_ = fVar141 * fVar185;
    auVar32._8_4_ = fVar141 * fVar202;
    auVar32._12_4_ = fVar137 * fVar77;
    auVar32._16_4_ = fVar141 * 0.0;
    auVar32._20_4_ = fVar137 * 0.0;
    auVar32._24_4_ = fVar141 * 0.0;
    auVar32._28_4_ = auVar21._4_4_;
    auVar21 = vfmadd231ps_fma(auVar32,auVar92,_local_4e8);
    fVar141 = auVar15._0_4_;
    fVar137 = auVar15._4_4_;
    auVar33._4_4_ = fVar137 * fVar201;
    auVar33._0_4_ = fVar141 * fVar185;
    auVar33._8_4_ = fVar141 * fVar202;
    auVar33._12_4_ = fVar137 * fVar77;
    auVar33._16_4_ = fVar141 * 0.0;
    auVar33._20_4_ = fVar137 * 0.0;
    auVar33._24_4_ = fVar141 * 0.0;
    auVar33._28_4_ = fVar76;
    auVar15 = vfmadd231ps_fma(auVar33,auVar92,auVar183);
    fVar141 = auVar20._0_4_;
    fVar138 = auVar20._4_4_;
    auVar34._4_4_ = fVar138 * fVar201;
    auVar34._0_4_ = fVar141 * fVar185;
    auVar34._8_4_ = fVar141 * fVar202;
    auVar34._12_4_ = fVar138 * fVar77;
    auVar34._16_4_ = fVar141 * 0.0;
    auVar34._20_4_ = fVar138 * 0.0;
    auVar34._24_4_ = fVar141 * 0.0;
    auVar34._28_4_ = fVar116;
    auVar20 = vfmadd231ps_fma(auVar34,auVar92,auVar200);
    local_318 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar253));
    fVar141 = auVar127._0_4_;
    fVar116 = auVar127._4_4_;
    auVar35._4_4_ = fVar116 * fVar201;
    auVar35._0_4_ = fVar141 * fVar185;
    auVar35._8_4_ = fVar141 * fVar202;
    auVar35._12_4_ = fVar116 * fVar77;
    auVar35._16_4_ = fVar141 * 0.0;
    auVar35._20_4_ = fVar116 * 0.0;
    auVar35._24_4_ = fVar141 * 0.0;
    auVar35._28_4_ = local_318._28_4_;
    auVar313 = vfmadd231ps_fma(auVar35,auVar92,auVar309);
    auVar26 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar79));
    auVar36._4_4_ = fVar201 * fStack_444;
    auVar36._0_4_ = fVar185 * local_448;
    auVar36._8_4_ = fVar202 * local_448;
    auVar36._12_4_ = fVar77 * fStack_444;
    auVar36._16_4_ = local_448 * 0.0;
    auVar36._20_4_ = fStack_444 * 0.0;
    auVar36._24_4_ = local_448 * 0.0;
    auVar36._28_4_ = fVar137;
    auVar127 = vfmadd231ps_fma(auVar36,auVar92,auVar327);
    auVar37._28_4_ = fVar116;
    auVar37._0_28_ =
         ZEXT1628(CONCAT412(fVar77 * auVar15._12_4_,
                            CONCAT48(fVar202 * auVar15._8_4_,
                                     CONCAT44(fVar201 * auVar15._4_4_,fVar185 * auVar15._0_4_))));
    auVar129 = vfmadd231ps_fma(auVar37,auVar92,ZEXT1632(auVar129));
    auVar21 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar77 * auVar20._12_4_,
                                                 CONCAT48(fVar202 * auVar20._8_4_,
                                                          CONCAT44(fVar201 * auVar20._4_4_,
                                                                   fVar185 * auVar20._0_4_)))),
                              auVar92,ZEXT1632(auVar21));
    fVar160 = auVar253._0_4_ + fVar160;
    fVar162 = auVar253._4_4_ + fVar162;
    fVar286 = auVar253._8_4_ + fVar286;
    fVar287 = auVar253._12_4_ + fVar287;
    fStack_438 = fStack_438 + 0.0;
    fStack_434 = fStack_434 + 0.0;
    fStack_430 = fStack_430 + 0.0;
    uStack_42c = 0x40400000;
    auVar38._28_4_ = 0x40400000;
    auVar38._0_28_ =
         ZEXT1628(CONCAT412(auVar127._12_4_ * fVar77,
                            CONCAT48(auVar127._8_4_ * fVar202,
                                     CONCAT44(auVar127._4_4_ * fVar201,auVar127._0_4_ * fVar185))));
    auVar15 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar77 * auVar313._12_4_,
                                                 CONCAT48(fVar202 * auVar313._8_4_,
                                                          CONCAT44(fVar201 * auVar313._4_4_,
                                                                   fVar185 * auVar313._0_4_)))),
                              auVar92,ZEXT1632(auVar15));
    auVar20 = vfmadd231ps_fma(auVar38,auVar92,ZEXT1632(auVar20));
    auVar313 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar77 * auVar15._12_4_,
                                                  CONCAT48(fVar202 * auVar15._8_4_,
                                                           CONCAT44(fVar201 * auVar15._4_4_,
                                                                    fVar185 * auVar15._0_4_)))),
                               auVar92,ZEXT1632(auVar129));
    auVar127 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar77 * auVar20._12_4_,
                                                  CONCAT48(fVar202 * auVar20._8_4_,
                                                           CONCAT44(fVar201 * auVar20._4_4_,
                                                                    fVar185 * auVar20._0_4_)))),
                               ZEXT1632(auVar21),auVar92);
    auVar92 = vsubps_avx(ZEXT1632(auVar15),ZEXT1632(auVar129));
    auVar22 = vsubps_avx(ZEXT1632(auVar20),ZEXT1632(auVar21));
    fVar185 = fVar76 * auVar92._0_4_ * 3.0;
    fVar201 = fVar76 * auVar92._4_4_ * 3.0;
    auVar39._4_4_ = fVar201;
    auVar39._0_4_ = fVar185;
    fVar202 = fVar76 * auVar92._8_4_ * 3.0;
    auVar39._8_4_ = fVar202;
    fVar77 = fVar76 * auVar92._12_4_ * 3.0;
    auVar39._12_4_ = fVar77;
    fVar138 = fVar76 * auVar92._16_4_ * 3.0;
    auVar39._16_4_ = fVar138;
    fVar139 = fVar76 * auVar92._20_4_ * 3.0;
    auVar39._20_4_ = fVar139;
    fVar140 = fVar76 * auVar92._24_4_ * 3.0;
    auVar39._24_4_ = fVar140;
    auVar39._28_4_ = 0x40400000;
    auVar243._0_4_ = fVar76 * auVar22._0_4_ * 3.0;
    auVar243._4_4_ = fVar76 * auVar22._4_4_ * 3.0;
    auVar243._8_4_ = fVar76 * auVar22._8_4_ * 3.0;
    auVar243._12_4_ = fVar76 * auVar22._12_4_ * 3.0;
    auVar243._16_4_ = fVar76 * auVar22._16_4_ * 3.0;
    auVar243._20_4_ = fVar76 * auVar22._20_4_ * 3.0;
    auVar243._24_4_ = fVar76 * auVar22._24_4_ * 3.0;
    auVar243._28_4_ = 0;
    auVar27 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar313));
    local_268 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar127));
    auVar92 = vsubps_avx(ZEXT1632(auVar313),ZEXT1632(auVar253));
    auVar22 = vsubps_avx(ZEXT1632(auVar127),ZEXT1632(auVar79));
    auVar24 = vsubps_avx(auVar27,local_318);
    fVar161 = auVar92._0_4_ + auVar24._0_4_;
    fVar221 = auVar92._4_4_ + auVar24._4_4_;
    fVar222 = auVar92._8_4_ + auVar24._8_4_;
    fVar223 = auVar92._12_4_ + auVar24._12_4_;
    fVar224 = auVar92._16_4_ + auVar24._16_4_;
    fVar225 = auVar92._20_4_ + auVar24._20_4_;
    fVar226 = auVar92._24_4_ + auVar24._24_4_;
    auVar25 = vsubps_avx(local_268,auVar26);
    auVar322._0_4_ = auVar22._0_4_ + auVar25._0_4_;
    auVar322._4_4_ = auVar22._4_4_ + auVar25._4_4_;
    auVar322._8_4_ = auVar22._8_4_ + auVar25._8_4_;
    auVar322._12_4_ = auVar22._12_4_ + auVar25._12_4_;
    auVar322._16_4_ = auVar22._16_4_ + auVar25._16_4_;
    auVar322._20_4_ = auVar22._20_4_ + auVar25._20_4_;
    auVar322._24_4_ = auVar22._24_4_ + auVar25._24_4_;
    auVar322._28_4_ = auVar22._28_4_ + auVar25._28_4_;
    fVar76 = auVar79._0_4_;
    local_138 = fVar76 + (float)local_468._0_4_;
    fVar141 = auVar79._4_4_;
    fStack_134 = fVar141 + (float)local_468._4_4_;
    fVar116 = auVar79._8_4_;
    fStack_130 = fVar116 + fStack_460;
    fVar137 = auVar79._12_4_;
    fStack_12c = fVar137 + fStack_45c;
    fStack_128 = fStack_458 + 0.0;
    fStack_124 = fStack_454 + 0.0;
    fStack_120 = fStack_450 + 0.0;
    fStack_11c = auVar23._28_4_ + 0.0;
    local_78 = ZEXT1632(auVar253);
    auVar22 = vsubps_avx(local_78,auVar30);
    local_b8 = vpermps_avx2(_DAT_0205d4a0,auVar22);
    local_98 = ZEXT1632(auVar79);
    auVar22 = vsubps_avx(local_98,_local_468);
    local_158 = vpermps_avx2(_DAT_0205d4a0,auVar22);
    local_d8._0_4_ = auVar313._0_4_ + fVar185;
    local_d8._4_4_ = auVar313._4_4_ + fVar201;
    local_d8._8_4_ = auVar313._8_4_ + fVar202;
    local_d8._12_4_ = auVar313._12_4_ + fVar77;
    local_d8._16_4_ = fVar138 + 0.0;
    local_d8._20_4_ = fVar139 + 0.0;
    local_d8._24_4_ = fVar140 + 0.0;
    local_d8._28_4_ = 0x40400000;
    auVar310 = ZEXT1632(auVar313);
    auVar22 = vsubps_avx(auVar310,auVar39);
    _local_468 = vpermps_avx2(_DAT_0205d4a0,auVar22);
    fVar185 = auVar127._0_4_;
    local_118._0_4_ = fVar185 + auVar243._0_4_;
    fVar201 = auVar127._4_4_;
    local_118._4_4_ = fVar201 + auVar243._4_4_;
    fVar202 = auVar127._8_4_;
    local_118._8_4_ = fVar202 + auVar243._8_4_;
    fVar77 = auVar127._12_4_;
    local_118._12_4_ = fVar77 + auVar243._12_4_;
    local_118._16_4_ = auVar243._16_4_ + 0.0;
    local_118._20_4_ = auVar243._20_4_ + 0.0;
    local_118._24_4_ = auVar243._24_4_ + 0.0;
    local_118._28_4_ = 0;
    auVar22 = vsubps_avx(ZEXT1632(auVar127),auVar243);
    local_f8 = vpermps_avx2(_DAT_0205d4a0,auVar22);
    auVar40._4_4_ = fVar141 * fVar221;
    auVar40._0_4_ = fVar76 * fVar161;
    auVar40._8_4_ = fVar116 * fVar222;
    auVar40._12_4_ = fVar137 * fVar223;
    auVar40._16_4_ = fVar224 * 0.0;
    auVar40._20_4_ = fVar225 * 0.0;
    auVar40._24_4_ = fVar226 * 0.0;
    auVar40._28_4_ = auVar22._28_4_;
    auVar21 = vfnmadd231ps_fma(auVar40,local_78,auVar322);
    auVar41._4_4_ = fStack_134 * fVar221;
    auVar41._0_4_ = local_138 * fVar161;
    auVar41._8_4_ = fStack_130 * fVar222;
    auVar41._12_4_ = fStack_12c * fVar223;
    auVar41._16_4_ = fStack_128 * fVar224;
    auVar41._20_4_ = fStack_124 * fVar225;
    auVar41._24_4_ = fStack_120 * fVar226;
    auVar41._28_4_ = local_468._28_4_;
    auVar56._4_4_ = fVar162;
    auVar56._0_4_ = fVar160;
    auVar56._8_4_ = fVar286;
    auVar56._12_4_ = fVar287;
    auVar56._16_4_ = fStack_438;
    auVar56._20_4_ = fStack_434;
    auVar56._24_4_ = fStack_430;
    auVar56._28_4_ = 0x40400000;
    auVar15 = vfnmadd231ps_fma(auVar41,auVar322,auVar56);
    auVar42._4_4_ = local_158._4_4_ * fVar221;
    auVar42._0_4_ = local_158._0_4_ * fVar161;
    auVar42._8_4_ = local_158._8_4_ * fVar222;
    auVar42._12_4_ = local_158._12_4_ * fVar223;
    auVar42._16_4_ = local_158._16_4_ * fVar224;
    auVar42._20_4_ = local_158._20_4_ * fVar225;
    auVar42._24_4_ = local_158._24_4_ * fVar226;
    auVar42._28_4_ = fStack_11c;
    auVar129 = vfnmadd231ps_fma(auVar42,local_b8,auVar322);
    local_4e8._0_4_ = auVar26._0_4_;
    local_4e8._4_4_ = auVar26._4_4_;
    uStack_4e0._0_4_ = auVar26._8_4_;
    uStack_4e0._4_4_ = auVar26._12_4_;
    uStack_4d8._0_4_ = auVar26._16_4_;
    uStack_4d8._4_4_ = auVar26._20_4_;
    uStack_4d0._0_4_ = auVar26._24_4_;
    auVar43._4_4_ = fVar221 * (float)local_4e8._4_4_;
    auVar43._0_4_ = fVar161 * (float)local_4e8._0_4_;
    auVar43._8_4_ = fVar222 * (float)uStack_4e0;
    auVar43._12_4_ = fVar223 * uStack_4e0._4_4_;
    auVar43._16_4_ = fVar224 * (float)uStack_4d8;
    auVar43._20_4_ = fVar225 * uStack_4d8._4_4_;
    auVar43._24_4_ = fVar226 * (float)uStack_4d0;
    auVar43._28_4_ = local_158._28_4_;
    auVar20 = vfnmadd231ps_fma(auVar43,local_318,auVar322);
    auVar60._4_4_ = fVar201 * fVar221;
    auVar60._0_4_ = fVar185 * fVar161;
    auVar60._8_4_ = fVar202 * fVar222;
    auVar60._12_4_ = fVar77 * fVar223;
    auVar60._16_4_ = fVar224 * 0.0;
    auVar60._20_4_ = fVar225 * 0.0;
    auVar60._24_4_ = fVar226 * 0.0;
    auVar60._28_4_ = DAT_0205d4a0._28_4_;
    auVar313 = vfnmadd231ps_fma(auVar60,auVar310,auVar322);
    auVar44._4_4_ = local_118._4_4_ * fVar221;
    auVar44._0_4_ = local_118._0_4_ * fVar161;
    auVar44._8_4_ = local_118._8_4_ * fVar222;
    auVar44._12_4_ = local_118._12_4_ * fVar223;
    auVar44._16_4_ = local_118._16_4_ * fVar224;
    auVar44._20_4_ = local_118._20_4_ * fVar225;
    auVar44._24_4_ = local_118._24_4_ * fVar226;
    auVar44._28_4_ = local_318._28_4_;
    auVar80 = vfnmadd231ps_fma(auVar44,local_d8,auVar322);
    auVar45._4_4_ = local_f8._4_4_ * fVar221;
    auVar45._0_4_ = local_f8._0_4_ * fVar161;
    auVar45._8_4_ = local_f8._8_4_ * fVar222;
    auVar45._12_4_ = local_f8._12_4_ * fVar223;
    auVar45._16_4_ = local_f8._16_4_ * fVar224;
    auVar45._20_4_ = local_f8._20_4_ * fVar225;
    auVar45._24_4_ = local_f8._24_4_ * fVar226;
    auVar45._28_4_ = local_b8._28_4_;
    auVar253 = vfnmadd231ps_fma(auVar45,auVar322,_local_468);
    auVar46._4_4_ = local_268._4_4_ * fVar221;
    auVar46._0_4_ = local_268._0_4_ * fVar161;
    auVar46._8_4_ = local_268._8_4_ * fVar222;
    auVar46._12_4_ = local_268._12_4_ * fVar223;
    auVar46._16_4_ = local_268._16_4_ * fVar224;
    auVar46._20_4_ = local_268._20_4_ * fVar225;
    auVar46._24_4_ = local_268._24_4_ * fVar226;
    auVar46._28_4_ = auVar92._28_4_ + auVar24._28_4_;
    auVar79 = vfnmadd231ps_fma(auVar46,auVar322,auVar27);
    auVar22 = vminps_avx(ZEXT1632(auVar21),ZEXT1632(auVar15));
    auVar92 = vmaxps_avx(ZEXT1632(auVar21),ZEXT1632(auVar15));
    auVar23 = vminps_avx(ZEXT1632(auVar129),ZEXT1632(auVar20));
    auVar23 = vminps_avx(auVar22,auVar23);
    auVar22 = vmaxps_avx(ZEXT1632(auVar129),ZEXT1632(auVar20));
    auVar92 = vmaxps_avx(auVar92,auVar22);
    auVar24 = vminps_avx(ZEXT1632(auVar313),ZEXT1632(auVar80));
    auVar22 = vmaxps_avx(ZEXT1632(auVar313),ZEXT1632(auVar80));
    auVar25 = vminps_avx(ZEXT1632(auVar253),ZEXT1632(auVar79));
    auVar24 = vminps_avx(auVar24,auVar25);
    auVar24 = vminps_avx(auVar23,auVar24);
    auVar23 = vmaxps_avx(ZEXT1632(auVar253),ZEXT1632(auVar79));
    auVar22 = vmaxps_avx(auVar22,auVar23);
    auVar22 = vmaxps_avx(auVar92,auVar22);
    auVar59._4_4_ = fStack_174;
    auVar59._0_4_ = local_178;
    auVar59._8_4_ = fStack_170;
    auVar59._12_4_ = fStack_16c;
    auVar59._16_4_ = fStack_168;
    auVar59._20_4_ = fStack_164;
    auVar59._24_4_ = fStack_160;
    auVar59._28_4_ = fStack_15c;
    auVar92 = vcmpps_avx(auVar24,auVar59,2);
    auVar58._4_4_ = uStack_194;
    auVar58._0_4_ = local_198;
    auVar58._8_4_ = uStack_190;
    auVar58._12_4_ = uStack_18c;
    auVar58._16_4_ = uStack_188;
    auVar58._20_4_ = uStack_184;
    auVar58._24_4_ = uStack_180;
    auVar58._28_4_ = uStack_17c;
    auVar22 = vcmpps_avx(auVar22,auVar58,5);
    auVar92 = vandps_avx(auVar22,auVar92);
    auVar22 = local_1d8 & auVar92;
    uVar64 = 0;
    if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar22 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar22 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar22 >> 0x7f,0) != '\0') ||
          (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar22 >> 0xbf,0) != '\0') ||
        (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar22[0x1f] < '\0')
    {
      auVar22 = vsubps_avx(local_318,local_78);
      auVar23 = vsubps_avx(auVar27,auVar310);
      fVar139 = auVar22._0_4_ + auVar23._0_4_;
      fVar140 = auVar22._4_4_ + auVar23._4_4_;
      fVar161 = auVar22._8_4_ + auVar23._8_4_;
      fVar221 = auVar22._12_4_ + auVar23._12_4_;
      fVar222 = auVar22._16_4_ + auVar23._16_4_;
      fVar223 = auVar22._20_4_ + auVar23._20_4_;
      fVar224 = auVar22._24_4_ + auVar23._24_4_;
      auVar24 = vsubps_avx(auVar26,local_98);
      auVar25 = vsubps_avx(local_268,ZEXT1632(auVar127));
      auVar115._0_4_ = auVar24._0_4_ + auVar25._0_4_;
      auVar115._4_4_ = auVar24._4_4_ + auVar25._4_4_;
      auVar115._8_4_ = auVar24._8_4_ + auVar25._8_4_;
      auVar115._12_4_ = auVar24._12_4_ + auVar25._12_4_;
      auVar115._16_4_ = auVar24._16_4_ + auVar25._16_4_;
      auVar115._20_4_ = auVar24._20_4_ + auVar25._20_4_;
      auVar115._24_4_ = auVar24._24_4_ + auVar25._24_4_;
      fVar138 = auVar25._28_4_;
      auVar115._28_4_ = auVar24._28_4_ + fVar138;
      auVar328._0_4_ = fVar76 * fVar139;
      auVar328._4_4_ = fVar141 * fVar140;
      auVar328._8_4_ = fVar116 * fVar161;
      auVar328._12_4_ = fVar137 * fVar221;
      auVar328._16_4_ = fVar222 * 0.0;
      auVar328._20_4_ = fVar223 * 0.0;
      auVar328._24_4_ = fVar224 * 0.0;
      auVar328._28_4_ = 0;
      auVar313 = vfnmadd231ps_fma(auVar328,auVar115,local_78);
      auVar47._4_4_ = fVar140 * fStack_134;
      auVar47._0_4_ = fVar139 * local_138;
      auVar47._8_4_ = fVar161 * fStack_130;
      auVar47._12_4_ = fVar221 * fStack_12c;
      auVar47._16_4_ = fVar222 * fStack_128;
      auVar47._20_4_ = fVar223 * fStack_124;
      auVar47._24_4_ = fVar224 * fStack_120;
      auVar47._28_4_ = fVar138;
      auVar57._4_4_ = fVar162;
      auVar57._0_4_ = fVar160;
      auVar57._8_4_ = fVar286;
      auVar57._12_4_ = fVar287;
      auVar57._16_4_ = fStack_438;
      auVar57._20_4_ = fStack_434;
      auVar57._24_4_ = fStack_430;
      auVar57._28_4_ = 0x40400000;
      auVar21 = vfnmadd213ps_fma(auVar57,auVar115,auVar47);
      auVar48._4_4_ = fVar140 * local_158._4_4_;
      auVar48._0_4_ = fVar139 * local_158._0_4_;
      auVar48._8_4_ = fVar161 * local_158._8_4_;
      auVar48._12_4_ = fVar221 * local_158._12_4_;
      auVar48._16_4_ = fVar222 * local_158._16_4_;
      auVar48._20_4_ = fVar223 * local_158._20_4_;
      auVar48._24_4_ = fVar224 * local_158._24_4_;
      auVar48._28_4_ = fVar138;
      auVar15 = vfnmadd213ps_fma(local_b8,auVar115,auVar48);
      auVar49._4_4_ = (float)local_4e8._4_4_ * fVar140;
      auVar49._0_4_ = (float)local_4e8._0_4_ * fVar139;
      auVar49._8_4_ = (float)uStack_4e0 * fVar161;
      auVar49._12_4_ = uStack_4e0._4_4_ * fVar221;
      auVar49._16_4_ = (float)uStack_4d8 * fVar222;
      auVar49._20_4_ = uStack_4d8._4_4_ * fVar223;
      auVar49._24_4_ = (float)uStack_4d0 * fVar224;
      auVar49._28_4_ = fVar138;
      auVar127 = vfnmadd231ps_fma(auVar49,auVar115,local_318);
      auVar135._0_4_ = fVar185 * fVar139;
      auVar135._4_4_ = fVar201 * fVar140;
      auVar135._8_4_ = fVar202 * fVar161;
      auVar135._12_4_ = fVar77 * fVar221;
      auVar135._16_4_ = fVar222 * 0.0;
      auVar135._20_4_ = fVar223 * 0.0;
      auVar135._24_4_ = fVar224 * 0.0;
      auVar135._28_4_ = 0;
      auVar80 = vfnmadd231ps_fma(auVar135,auVar115,auVar310);
      auVar50._4_4_ = fVar140 * local_118._4_4_;
      auVar50._0_4_ = fVar139 * local_118._0_4_;
      auVar50._8_4_ = fVar161 * local_118._8_4_;
      auVar50._12_4_ = fVar221 * local_118._12_4_;
      auVar50._16_4_ = fVar222 * local_118._16_4_;
      auVar50._20_4_ = fVar223 * local_118._20_4_;
      auVar50._24_4_ = fVar224 * local_118._24_4_;
      auVar50._28_4_ = auVar26._28_4_;
      auVar129 = vfnmadd213ps_fma(local_d8,auVar115,auVar50);
      auVar51._4_4_ = fVar140 * local_f8._4_4_;
      auVar51._0_4_ = fVar139 * local_f8._0_4_;
      auVar51._8_4_ = fVar161 * local_f8._8_4_;
      auVar51._12_4_ = fVar221 * local_f8._12_4_;
      auVar51._16_4_ = fVar222 * local_f8._16_4_;
      auVar51._20_4_ = fVar223 * local_f8._20_4_;
      auVar51._24_4_ = fVar224 * local_f8._24_4_;
      auVar51._28_4_ = auVar26._28_4_;
      auVar20 = vfnmadd213ps_fma(_local_468,auVar115,auVar51);
      auVar52._4_4_ = local_268._4_4_ * fVar140;
      auVar52._0_4_ = local_268._0_4_ * fVar139;
      auVar52._8_4_ = local_268._8_4_ * fVar161;
      auVar52._12_4_ = local_268._12_4_ * fVar221;
      auVar52._16_4_ = local_268._16_4_ * fVar222;
      auVar52._20_4_ = local_268._20_4_ * fVar223;
      auVar52._24_4_ = local_268._24_4_ * fVar224;
      auVar52._28_4_ = auVar22._28_4_ + auVar23._28_4_;
      auVar253 = vfnmadd231ps_fma(auVar52,auVar115,auVar27);
      auVar23 = vminps_avx(ZEXT1632(auVar313),ZEXT1632(auVar21));
      auVar22 = vmaxps_avx(ZEXT1632(auVar313),ZEXT1632(auVar21));
      auVar24 = vminps_avx(ZEXT1632(auVar15),ZEXT1632(auVar127));
      auVar24 = vminps_avx(auVar23,auVar24);
      auVar23 = vmaxps_avx(ZEXT1632(auVar15),ZEXT1632(auVar127));
      auVar22 = vmaxps_avx(auVar22,auVar23);
      auVar25 = vminps_avx(ZEXT1632(auVar80),ZEXT1632(auVar129));
      auVar23 = vmaxps_avx(ZEXT1632(auVar80),ZEXT1632(auVar129));
      auVar26 = vminps_avx(ZEXT1632(auVar20),ZEXT1632(auVar253));
      auVar25 = vminps_avx(auVar25,auVar26);
      auVar25 = vminps_avx(auVar24,auVar25);
      auVar24 = vmaxps_avx(ZEXT1632(auVar20),ZEXT1632(auVar253));
      auVar23 = vmaxps_avx(auVar23,auVar24);
      auVar23 = vmaxps_avx(auVar22,auVar23);
      auVar22 = vcmpps_avx(auVar25,auVar59,2);
      auVar23 = vcmpps_avx(auVar23,auVar58,5);
      auVar22 = vandps_avx(auVar23,auVar22);
      auVar92 = vandps_avx(auVar92,local_1d8);
      auVar23 = auVar92 & auVar22;
      if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar23 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar23 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar23 >> 0x7f,0) != '\0') ||
            (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar23 >> 0xbf,0) != '\0') ||
          (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar23[0x1f] < '\0') {
        auVar92 = vandps_avx(auVar22,auVar92);
        uVar64 = vmovmskps_avx(auVar92);
      }
    }
    if (uVar64 != 0) {
      auStack_2a8[uVar67] = uVar64;
      uVar203 = vmovlps_avx(local_1f8);
      *(undefined8 *)(&uStack_1b8 + uVar67 * 2) = uVar203;
      uVar72 = vmovlps_avx(_local_518);
      auStack_58[uVar67] = uVar72;
      uVar67 = (ulong)((int)uVar67 + 1);
    }
    do {
      if ((int)uVar67 == 0) {
        if ((uVar73 & 1) != 0) {
          return local_549;
        }
        fVar185 = ray->tfar;
        auVar91._4_4_ = fVar185;
        auVar91._0_4_ = fVar185;
        auVar91._8_4_ = fVar185;
        auVar91._12_4_ = fVar185;
        auVar21 = vcmpps_avx(local_208,auVar91,2);
        uVar66 = vmovmskps_avx(auVar21);
        uVar63 = uVar63 & SUB84(auVar75,0) & uVar66;
        local_549 = uVar63 != 0;
        if (!local_549) {
          return local_549;
        }
        goto LAB_0178a3a1;
      }
      uVar65 = (int)uVar67 - 1;
      uVar68 = (ulong)uVar65;
      uVar71 = auStack_2a8[uVar68];
      uVar64 = (&uStack_1b8)[uVar68 * 2];
      fVar185 = afStack_1b4[uVar68 * 2];
      iVar28 = 0;
      for (uVar72 = (ulong)uVar71; (uVar72 & 1) == 0; uVar72 = uVar72 >> 1 | 0x8000000000000000) {
        iVar28 = iVar28 + 1;
      }
      uVar71 = uVar71 - 1 & uVar71;
      if (uVar71 == 0) {
        uVar67 = (ulong)uVar65;
      }
      register0x00001348 = 0;
      local_518 = (undefined1  [8])auStack_58[uVar68];
      auVar329 = ZEXT864(0);
      auStack_2a8[uVar68] = uVar71;
      fVar201 = (float)(iVar28 + 1) * 0.14285715;
      auVar21 = vfmadd231ss_fma(ZEXT416((uint)(fVar185 * (float)iVar28 * 0.14285715)),
                                ZEXT416(uVar64),ZEXT416((uint)(1.0 - (float)iVar28 * 0.14285715)));
      auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar185 * fVar201)),ZEXT416(uVar64),
                                ZEXT416((uint)(1.0 - fVar201)));
      auVar220._0_4_ = auVar21._0_4_;
      local_448 = auVar15._0_4_;
      fVar185 = local_448 - auVar220._0_4_;
      fStack_444 = auVar15._4_4_;
      uStack_440 = auVar15._8_4_;
      uStack_43c = auVar15._12_4_;
      if (0.16666667 <= fVar185) break;
      auVar129 = vshufps_avx(_local_518,_local_518,0x50);
      auVar124._8_4_ = 0x3f800000;
      auVar124._0_8_ = &DAT_3f8000003f800000;
      auVar124._12_4_ = 0x3f800000;
      auVar20 = vsubps_avx(auVar124,auVar129);
      fVar201 = auVar129._0_4_;
      auVar151._0_4_ = fVar311 * fVar201;
      fVar202 = auVar129._4_4_;
      auVar151._4_4_ = fVar312 * fVar202;
      fVar77 = auVar129._8_4_;
      auVar151._8_4_ = fVar311 * fVar77;
      fVar76 = auVar129._12_4_;
      auVar151._12_4_ = fVar312 * fVar76;
      auVar173._0_4_ = fVar227 * fVar201;
      auVar173._4_4_ = fVar244 * fVar202;
      auVar173._8_4_ = fVar227 * fVar77;
      auVar173._12_4_ = fVar244 * fVar76;
      auVar194._0_4_ = fVar262 * fVar201;
      auVar194._4_4_ = fVar273 * fVar202;
      auVar194._8_4_ = fVar262 * fVar77;
      auVar194._12_4_ = fVar273 * fVar76;
      auVar107._0_4_ = fVar274 * fVar201;
      auVar107._4_4_ = fVar285 * fVar202;
      auVar107._8_4_ = fVar274 * fVar77;
      auVar107._12_4_ = fVar285 * fVar76;
      auVar129 = vfmadd231ps_fma(auVar151,auVar20,local_3c8);
      auVar313 = vfmadd231ps_fma(auVar173,auVar20,local_3d8);
      auVar127 = vfmadd231ps_fma(auVar194,auVar20,local_3e8);
      auVar20 = vfmadd231ps_fma(auVar107,auVar20,local_3f8);
      auVar136._16_16_ = auVar129;
      auVar136._0_16_ = auVar129;
      auVar158._16_16_ = auVar313;
      auVar158._0_16_ = auVar313;
      auVar184._16_16_ = auVar127;
      auVar184._0_16_ = auVar127;
      auVar220._4_4_ = auVar220._0_4_;
      auVar220._8_4_ = auVar220._0_4_;
      auVar220._12_4_ = auVar220._0_4_;
      auVar220._20_4_ = local_448;
      auVar220._16_4_ = local_448;
      auVar220._24_4_ = local_448;
      auVar220._28_4_ = local_448;
      auVar92 = vsubps_avx(auVar158,auVar136);
      auVar313 = vfmadd213ps_fma(auVar92,auVar220,auVar136);
      auVar92 = vsubps_avx(auVar184,auVar158);
      auVar80 = vfmadd213ps_fma(auVar92,auVar220,auVar158);
      auVar129 = vsubps_avx(auVar20,auVar127);
      auVar159._16_16_ = auVar129;
      auVar159._0_16_ = auVar129;
      auVar129 = vfmadd213ps_fma(auVar159,auVar220,auVar184);
      auVar92 = vsubps_avx(ZEXT1632(auVar80),ZEXT1632(auVar313));
      auVar20 = vfmadd213ps_fma(auVar92,auVar220,ZEXT1632(auVar313));
      auVar92 = vsubps_avx(ZEXT1632(auVar129),ZEXT1632(auVar80));
      auVar129 = vfmadd213ps_fma(auVar92,auVar220,ZEXT1632(auVar80));
      auVar92 = vsubps_avx(ZEXT1632(auVar129),ZEXT1632(auVar20));
      auVar93 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar92,auVar220);
      fVar116 = auVar92._4_4_ * 3.0;
      fVar141 = fVar185 * 0.33333334;
      auVar279._0_8_ =
           CONCAT44(auVar93._4_4_ + fVar141 * fVar116,auVar93._0_4_ + fVar141 * auVar92._0_4_ * 3.0)
      ;
      auVar279._8_4_ = auVar93._8_4_ + fVar141 * auVar92._8_4_ * 3.0;
      auVar279._12_4_ = auVar93._12_4_ + fVar141 * auVar92._12_4_ * 3.0;
      auVar20 = vshufpd_avx(auVar93,auVar93,3);
      auVar313 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      _local_468 = auVar20;
      auVar22 = _local_468;
      auVar129 = vsubps_avx(auVar20,auVar93);
      auVar127 = vsubps_avx(auVar313,(undefined1  [16])0x0);
      auVar125._0_4_ = auVar129._0_4_ + auVar127._0_4_;
      auVar125._4_4_ = auVar129._4_4_ + auVar127._4_4_;
      auVar125._8_4_ = auVar129._8_4_ + auVar127._8_4_;
      auVar125._12_4_ = auVar129._12_4_ + auVar127._12_4_;
      auVar129 = vshufps_avx(auVar93,auVar93,0xb1);
      auVar127 = vshufps_avx(auVar279,auVar279,0xb1);
      auVar315._4_4_ = auVar125._0_4_;
      auVar315._0_4_ = auVar125._0_4_;
      auVar315._8_4_ = auVar125._0_4_;
      auVar315._12_4_ = auVar125._0_4_;
      auVar80 = vshufps_avx(auVar125,auVar125,0x55);
      fVar201 = auVar80._0_4_;
      auVar233._0_4_ = auVar129._0_4_ * fVar201;
      fVar202 = auVar80._4_4_;
      auVar233._4_4_ = auVar129._4_4_ * fVar202;
      fVar77 = auVar80._8_4_;
      auVar233._8_4_ = auVar129._8_4_ * fVar77;
      fVar76 = auVar80._12_4_;
      auVar233._12_4_ = auVar129._12_4_ * fVar76;
      auVar251._0_4_ = auVar127._0_4_ * fVar201;
      auVar251._4_4_ = auVar127._4_4_ * fVar202;
      auVar251._8_4_ = auVar127._8_4_ * fVar77;
      auVar251._12_4_ = auVar127._12_4_ * fVar76;
      auVar253 = vfmadd231ps_fma(auVar233,auVar315,auVar93);
      local_318._0_16_ = auVar279;
      auVar79 = vfmadd231ps_fma(auVar251,auVar315,auVar279);
      auVar127 = vshufps_avx(auVar253,auVar253,0xe8);
      auVar80 = vshufps_avx(auVar79,auVar79,0xe8);
      auVar129 = vcmpps_avx(auVar127,auVar80,1);
      uVar64 = vextractps_avx(auVar129,0);
      auVar94 = auVar79;
      if ((uVar64 & 1) == 0) {
        auVar94 = auVar253;
      }
      auVar174._0_4_ = fVar141 * auVar92._16_4_ * 3.0;
      auVar174._4_4_ = fVar141 * fVar116;
      auVar174._8_4_ = fVar141 * auVar92._24_4_ * 3.0;
      auVar174._12_4_ = fVar141 * local_448;
      auVar118 = vsubps_avx((undefined1  [16])0x0,auVar174);
      auVar175 = vshufps_avx(auVar118,auVar118,0xb1);
      auVar100 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar332._0_4_ = auVar175._0_4_ * fVar201;
      auVar332._4_4_ = auVar175._4_4_ * fVar202;
      auVar332._8_4_ = auVar175._8_4_ * fVar77;
      auVar332._12_4_ = auVar175._12_4_ * fVar76;
      auVar126._0_4_ = auVar100._0_4_ * fVar201;
      auVar126._4_4_ = auVar100._4_4_ * fVar202;
      auVar126._8_4_ = auVar100._8_4_ * fVar77;
      auVar126._12_4_ = auVar100._12_4_ * fVar76;
      auVar119 = vfmadd231ps_fma(auVar332,auVar315,auVar118);
      auVar163 = vfmadd231ps_fma(auVar126,(undefined1  [16])0x0,auVar315);
      auVar100 = vshufps_avx(auVar119,auVar119,0xe8);
      auVar117 = vshufps_avx(auVar163,auVar163,0xe8);
      auVar175 = vcmpps_avx(auVar100,auVar117,1);
      uVar64 = vextractps_avx(auVar175,0);
      auVar186 = auVar163;
      if ((uVar64 & 1) == 0) {
        auVar186 = auVar119;
      }
      auVar94 = vmaxss_avx(auVar186,auVar94);
      auVar127 = vminps_avx(auVar127,auVar80);
      auVar80 = vminps_avx(auVar100,auVar117);
      auVar80 = vminps_avx(auVar127,auVar80);
      auVar129 = vshufps_avx(auVar129,auVar129,0x55);
      auVar129 = vblendps_avx(auVar129,auVar175,2);
      auVar175 = vpslld_avx(auVar129,0x1f);
      auVar129 = vshufpd_avx(auVar79,auVar79,1);
      auVar129 = vinsertps_avx(auVar129,auVar163,0x9c);
      auVar127 = vshufpd_avx(auVar253,auVar253,1);
      auVar127 = vinsertps_avx(auVar127,auVar119,0x9c);
      auVar129 = vblendvps_avx(auVar127,auVar129,auVar175);
      auVar127 = vmovshdup_avx(auVar129);
      auVar129 = vmaxss_avx(auVar127,auVar129);
      fVar77 = auVar80._0_4_;
      auVar127 = vmovshdup_avx(auVar80);
      fVar202 = auVar129._0_4_;
      fVar201 = auVar94._0_4_;
      _local_468 = auVar22;
      if ((0.0001 <= fVar77) || (fVar202 <= -0.0001)) {
        auVar253 = vcmpps_avx(auVar127,SUB6416(ZEXT464(0x38d1b717),0),1);
        auVar79 = vcmpps_avx(auVar80,SUB6416(ZEXT464(0x38d1b717),0),1);
        auVar253 = vorps_avx(auVar79,auVar253);
        if ((-0.0001 < fVar201 & auVar253[0]) != 0) goto LAB_0178b901;
        auVar253 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar129,5);
        auVar79 = vcmpps_avx(auVar127,SUB6416(ZEXT464(0x38d1b717),0),5);
        auVar253 = vorps_avx(auVar79,auVar253);
        if ((auVar253 & (undefined1  [16])0x1) == (undefined1  [16])0x0) goto LAB_0178b901;
LAB_0178c430:
        auVar329 = ZEXT1664(auVar127);
        bVar53 = true;
      }
      else {
LAB_0178b901:
        auVar79 = vcmpps_avx(auVar80,_DAT_01feba10,1);
        auVar175 = SUB6416(ZEXT864(0),0) << 0x20;
        auVar253 = vcmpss_avx(auVar94,ZEXT816(0) << 0x20,1);
        auVar195._8_4_ = 0x3f800000;
        auVar195._0_8_ = &DAT_3f8000003f800000;
        auVar195._12_4_ = 0x3f800000;
        auVar252._8_4_ = 0xbf800000;
        auVar252._0_8_ = 0xbf800000bf800000;
        auVar252._12_4_ = 0xbf800000;
        auVar253 = vblendvps_avx(auVar195,auVar252,auVar253);
        auVar79 = vblendvps_avx(auVar195,auVar252,auVar79);
        fVar76 = auVar79._0_4_;
        fVar141 = auVar253._0_4_;
        auVar253 = SUB6416(ZEXT864(0),0) << 0x20;
        if ((fVar76 == fVar141) && (!NAN(fVar76) && !NAN(fVar141))) {
          auVar253 = SUB6416(ZEXT464(0x7f800000),0);
        }
        if ((fVar76 == fVar141) && (!NAN(fVar76) && !NAN(fVar141))) {
          auVar175 = SUB6416(ZEXT464(0xff800000),0);
        }
        auVar79 = vmovshdup_avx(auVar79);
        fVar116 = auVar79._0_4_;
        auVar79 = SUB6416(ZEXT464(0x3f800000),0);
        if ((fVar76 != fVar116) || (NAN(fVar76) || NAN(fVar116))) {
          fVar76 = auVar127._0_4_;
          if ((fVar76 != fVar77) || (NAN(fVar76) || NAN(fVar77))) {
            auVar128._0_4_ = (float)((uint)fVar77 ^ local_368);
            auVar128._4_4_ = auVar80._4_4_ ^ uStack_364;
            auVar128._8_4_ = auVar80._8_4_ ^ uStack_360;
            auVar128._12_4_ = auVar80._12_4_ ^ uStack_35c;
            auVar176._0_4_ = auVar128._0_4_ / (fVar76 - fVar77);
            auVar176._4_12_ = auVar128._4_12_;
            auVar54._12_4_ = 0;
            auVar54._0_12_ = ZEXT812(0);
            auVar196._12_4_ = 0;
            auVar196._0_12_ = ZEXT812(0);
            auVar196 = auVar196 << 0x20;
            auVar127 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar176._0_4_)),auVar54 << 0x20,
                                       auVar176);
            auVar80 = auVar127;
          }
          else {
            auVar127 = SUB6416(ZEXT464(0x7f800000),0);
            if ((fVar77 == 0.0) && (auVar127 = SUB6416(ZEXT464(0x7f800000),0), !NAN(fVar77))) {
              auVar127 = ZEXT816(0);
            }
            auVar196 = SUB6416(ZEXT864(0),0) << 0x20;
            auVar80 = SUB6416(ZEXT464(0xff800000),0);
            if ((fVar77 == 0.0) && (auVar80 = SUB6416(ZEXT464(0xff800000),0), !NAN(fVar77))) {
              auVar80 = auVar79;
            }
          }
          auVar253 = vminss_avx(auVar253,auVar127);
          auVar175 = vmaxss_avx(auVar80,auVar175);
        }
        else {
          auVar196 = ZEXT816(0) << 0x20;
        }
        auVar329 = ZEXT1664(_local_518);
        auVar129 = vcmpss_avx(auVar129,auVar196,1);
        auVar177._8_4_ = 0x3f800000;
        auVar177._0_8_ = &DAT_3f8000003f800000;
        auVar177._12_4_ = 0x3f800000;
        auVar304._8_4_ = 0xbf800000;
        auVar304._0_8_ = 0xbf800000bf800000;
        auVar304._12_4_ = 0xbf800000;
        auVar129 = vblendvps_avx(auVar177,auVar304,auVar129);
        fVar77 = auVar129._0_4_;
        if ((fVar141 != fVar77) || (NAN(fVar141) || NAN(fVar77))) {
          if ((fVar202 != fVar201) || (NAN(fVar202) || NAN(fVar201))) {
            auVar130._0_4_ = (float)((uint)fVar201 ^ local_368);
            auVar130._4_4_ = auVar94._4_4_ ^ uStack_364;
            auVar130._8_4_ = auVar94._8_4_ ^ uStack_360;
            auVar130._12_4_ = auVar94._12_4_ ^ uStack_35c;
            auVar178._0_4_ = auVar130._0_4_ / (fVar202 - fVar201);
            auVar178._4_12_ = auVar130._4_12_;
            auVar129 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar178._0_4_)),auVar196,auVar178);
            auVar127 = auVar129;
          }
          else {
            auVar129 = SUB6416(ZEXT464(0x7f800000),0);
            if ((fVar201 == 0.0) && (auVar129 = SUB6416(ZEXT464(0x7f800000),0), !NAN(fVar201))) {
              auVar129 = ZEXT816(0);
            }
            auVar127 = SUB6416(ZEXT464(0xff800000),0);
            if ((fVar201 == 0.0) && (auVar127 = SUB6416(ZEXT464(0xff800000),0), !NAN(fVar201))) {
              auVar127 = auVar79;
            }
          }
          auVar253 = vminss_avx(auVar253,auVar129);
          auVar175 = vmaxss_avx(auVar127,auVar175);
        }
        if ((fVar116 != fVar77) || (NAN(fVar116) || NAN(fVar77))) {
          auVar253 = vminss_avx(auVar253,auVar79);
          auVar175 = vmaxss_avx(auVar79,auVar175);
        }
        auVar129 = vmaxss_avx(auVar196,auVar253);
        auVar127 = vminss_avx(auVar175,auVar79);
        bVar53 = true;
        if (auVar129._0_4_ <= auVar127._0_4_) {
          auVar129 = vmaxss_avx(auVar196,ZEXT416((uint)(auVar129._0_4_ + -0.1)));
          auVar127 = vminss_avx(ZEXT416((uint)(auVar127._0_4_ + 0.1)),auVar79);
          auVar108._0_8_ = auVar93._0_8_;
          auVar108._8_8_ = auVar108._0_8_;
          auVar254._8_8_ = auVar279._0_8_;
          auVar254._0_8_ = auVar279._0_8_;
          auVar268._8_8_ = auVar118._0_8_;
          auVar268._0_8_ = auVar118._0_8_;
          auVar80 = vshufpd_avx(auVar279,auVar279,3);
          auVar253 = vshufpd_avx(auVar118,auVar118,3);
          auVar79 = vshufps_avx(auVar129,auVar127,0);
          auVar152._8_4_ = 0x3f800000;
          auVar152._0_8_ = &DAT_3f8000003f800000;
          auVar152._12_4_ = 0x3f800000;
          auVar93 = vsubps_avx(auVar152,auVar79);
          local_468._0_4_ = auVar20._0_4_;
          local_468._4_4_ = auVar20._4_4_;
          fStack_460 = auVar20._8_4_;
          fStack_45c = auVar20._12_4_;
          fVar201 = auVar79._0_4_;
          auVar153._0_4_ = fVar201 * (float)local_468._0_4_;
          fVar202 = auVar79._4_4_;
          auVar153._4_4_ = fVar202 * (float)local_468._4_4_;
          fVar77 = auVar79._8_4_;
          auVar153._8_4_ = fVar77 * fStack_460;
          fVar76 = auVar79._12_4_;
          auVar153._12_4_ = fVar76 * fStack_45c;
          auVar179._0_4_ = auVar80._0_4_ * fVar201;
          auVar179._4_4_ = auVar80._4_4_ * fVar202;
          auVar179._8_4_ = auVar80._8_4_ * fVar77;
          auVar179._12_4_ = auVar80._12_4_ * fVar76;
          auVar197._0_4_ = auVar253._0_4_ * fVar201;
          auVar197._4_4_ = auVar253._4_4_ * fVar202;
          auVar197._8_4_ = auVar253._8_4_ * fVar77;
          auVar197._12_4_ = auVar253._12_4_ * fVar76;
          local_4e8._0_4_ = auVar313._0_4_;
          local_4e8._4_4_ = auVar313._4_4_;
          uStack_4e0._0_4_ = auVar313._8_4_;
          uStack_4e0._4_4_ = auVar313._12_4_;
          auVar215._0_4_ = fVar201 * (float)local_4e8._0_4_;
          auVar215._4_4_ = fVar202 * (float)local_4e8._4_4_;
          auVar215._8_4_ = fVar77 * (float)uStack_4e0;
          auVar215._12_4_ = fVar76 * uStack_4e0._4_4_;
          auVar80 = vfmadd231ps_fma(auVar153,auVar93,auVar108);
          auVar253 = vfmadd231ps_fma(auVar179,auVar93,auVar254);
          auVar79 = vfmadd231ps_fma(auVar197,auVar93,auVar268);
          auVar93 = vfmadd231ps_fma(auVar215,auVar93,ZEXT816(0));
          auVar20 = vmovshdup_avx(_local_518);
          auVar100 = vfmadd231ss_fma(ZEXT416((uint)(auVar20._0_4_ * auVar129._0_4_)),_local_518,
                                     ZEXT416((uint)(1.0 - auVar129._0_4_)));
          auVar117 = vfmadd231ss_fma(ZEXT416((uint)(auVar20._0_4_ * auVar127._0_4_)),_local_518,
                                     ZEXT416((uint)(1.0 - auVar127._0_4_)));
          fVar201 = 1.0 / fVar185;
          auVar129 = vsubps_avx(auVar253,auVar80);
          auVar234._0_4_ = auVar129._0_4_ * 3.0;
          auVar234._4_4_ = auVar129._4_4_ * 3.0;
          auVar234._8_4_ = auVar129._8_4_ * 3.0;
          auVar234._12_4_ = auVar129._12_4_ * 3.0;
          auVar129 = vsubps_avx(auVar79,auVar253);
          auVar255._0_4_ = auVar129._0_4_ * 3.0;
          auVar255._4_4_ = auVar129._4_4_ * 3.0;
          auVar255._8_4_ = auVar129._8_4_ * 3.0;
          auVar255._12_4_ = auVar129._12_4_ * 3.0;
          auVar129 = vsubps_avx(auVar93,auVar79);
          auVar269._0_4_ = auVar129._0_4_ * 3.0;
          auVar269._4_4_ = auVar129._4_4_ * 3.0;
          auVar269._8_4_ = auVar129._8_4_ * 3.0;
          auVar269._12_4_ = auVar129._12_4_ * 3.0;
          auVar20 = vminps_avx(auVar255,auVar269);
          auVar129 = vmaxps_avx(auVar255,auVar269);
          auVar20 = vminps_avx(auVar234,auVar20);
          auVar129 = vmaxps_avx(auVar234,auVar129);
          auVar313 = vshufpd_avx(auVar20,auVar20,3);
          auVar127 = vshufpd_avx(auVar129,auVar129,3);
          auVar20 = vminps_avx(auVar20,auVar313);
          auVar129 = vmaxps_avx(auVar129,auVar127);
          auVar256._0_4_ = auVar20._0_4_ * fVar201;
          auVar256._4_4_ = auVar20._4_4_ * fVar201;
          auVar256._8_4_ = auVar20._8_4_ * fVar201;
          auVar256._12_4_ = auVar20._12_4_ * fVar201;
          auVar235._0_4_ = fVar201 * auVar129._0_4_;
          auVar235._4_4_ = fVar201 * auVar129._4_4_;
          auVar235._8_4_ = fVar201 * auVar129._8_4_;
          auVar235._12_4_ = fVar201 * auVar129._12_4_;
          fVar201 = 1.0 / (auVar117._0_4_ - auVar100._0_4_);
          auVar129 = vshufpd_avx(auVar80,auVar80,3);
          auVar20 = vshufpd_avx(auVar253,auVar253,3);
          auVar313 = vshufpd_avx(auVar79,auVar79,3);
          auVar127 = vshufpd_avx(auVar93,auVar93,3);
          auVar129 = vsubps_avx(auVar129,auVar80);
          auVar80 = vsubps_avx(auVar20,auVar253);
          auVar253 = vsubps_avx(auVar313,auVar79);
          auVar127 = vsubps_avx(auVar127,auVar93);
          auVar20 = vminps_avx(auVar129,auVar80);
          auVar129 = vmaxps_avx(auVar129,auVar80);
          auVar313 = vminps_avx(auVar253,auVar127);
          auVar313 = vminps_avx(auVar20,auVar313);
          auVar20 = vmaxps_avx(auVar253,auVar127);
          auVar129 = vmaxps_avx(auVar129,auVar20);
          auVar294._0_4_ = fVar201 * auVar313._0_4_;
          auVar294._4_4_ = fVar201 * auVar313._4_4_;
          auVar294._8_4_ = fVar201 * auVar313._8_4_;
          auVar294._12_4_ = fVar201 * auVar313._12_4_;
          auVar280._0_4_ = fVar201 * auVar129._0_4_;
          auVar280._4_4_ = fVar201 * auVar129._4_4_;
          auVar280._8_4_ = fVar201 * auVar129._8_4_;
          auVar280._12_4_ = fVar201 * auVar129._12_4_;
          auVar80 = vinsertps_avx(auVar21,auVar100,0x10);
          auVar253 = vinsertps_avx(auVar15,auVar117,0x10);
          auVar90._0_4_ = (auVar80._0_4_ + auVar253._0_4_) * 0.5;
          auVar90._4_4_ = (auVar80._4_4_ + auVar253._4_4_) * 0.5;
          auVar90._8_4_ = (auVar80._8_4_ + auVar253._8_4_) * 0.5;
          auVar90._12_4_ = (auVar80._12_4_ + auVar253._12_4_) * 0.5;
          auVar154._4_4_ = auVar90._0_4_;
          auVar154._0_4_ = auVar90._0_4_;
          auVar154._8_4_ = auVar90._0_4_;
          auVar154._12_4_ = auVar90._0_4_;
          auVar129 = vfmadd213ps_fma(local_338,auVar154,auVar16);
          auVar20 = vfmadd213ps_fma(local_348,auVar154,auVar17);
          auVar313 = vfmadd213ps_fma(_local_358,auVar154,auVar168);
          auVar15 = vsubps_avx(auVar20,auVar129);
          auVar129 = vfmadd213ps_fma(auVar15,auVar154,auVar129);
          auVar15 = vsubps_avx(auVar313,auVar20);
          auVar15 = vfmadd213ps_fma(auVar15,auVar154,auVar20);
          auVar15 = vsubps_avx(auVar15,auVar129);
          auVar129 = vfmadd231ps_fma(auVar129,auVar15,auVar154);
          auVar155._0_8_ = CONCAT44(auVar15._4_4_ * 3.0,auVar15._0_4_ * 3.0);
          auVar155._8_4_ = auVar15._8_4_ * 3.0;
          auVar155._12_4_ = auVar15._12_4_ * 3.0;
          auVar270._8_8_ = auVar129._0_8_;
          auVar270._0_8_ = auVar129._0_8_;
          auVar15 = vshufpd_avx(auVar129,auVar129,3);
          auVar129 = vshufps_avx(auVar90,auVar90,0x55);
          auVar127 = vsubps_avx(auVar15,auVar270);
          auVar93 = vfmadd231ps_fma(auVar270,auVar129,auVar127);
          auVar316._8_8_ = auVar155._0_8_;
          auVar316._0_8_ = auVar155._0_8_;
          auVar15 = vshufpd_avx(auVar155,auVar155,3);
          auVar15 = vsubps_avx(auVar15,auVar316);
          auVar79 = vfmadd213ps_fma(auVar15,auVar129,auVar316);
          auVar129 = vmovshdup_avx(auVar79);
          auVar317._0_8_ = auVar129._0_8_ ^ 0x8000000080000000;
          auVar317._8_4_ = auVar129._8_4_ ^ 0x80000000;
          auVar317._12_4_ = auVar129._12_4_ ^ 0x80000000;
          auVar20 = vmovshdup_avx(auVar127);
          auVar15 = vunpcklps_avx(auVar20,auVar317);
          auVar313 = vshufps_avx(auVar15,auVar317,4);
          auVar333._0_8_ = auVar127._0_8_ ^ 0x8000000080000000;
          auVar333._8_4_ = auVar127._8_4_ ^ 0x80000000;
          auVar333._12_4_ = auVar127._12_4_ ^ 0x80000000;
          auVar15 = vmovlhps_avx(auVar333,auVar79);
          auVar15 = vshufps_avx(auVar15,auVar79,8);
          auVar129 = vfmsub231ss_fma(ZEXT416((uint)(auVar129._0_4_ * auVar127._0_4_)),auVar20,
                                     auVar79);
          auVar180._0_4_ = auVar129._0_4_;
          auVar180._4_4_ = auVar180._0_4_;
          auVar180._8_4_ = auVar180._0_4_;
          auVar180._12_4_ = auVar180._0_4_;
          auVar129 = vdivps_avx(auVar313,auVar180);
          auVar20 = vdivps_avx(auVar15,auVar180);
          fVar77 = auVar93._0_4_;
          fVar201 = auVar129._0_4_;
          auVar15 = vshufps_avx(auVar93,auVar93,0x55);
          fVar202 = auVar20._0_4_;
          local_4e8._4_4_ = fVar77 * auVar129._4_4_ + auVar15._4_4_ * auVar20._4_4_;
          local_4e8._0_4_ = fVar77 * fVar201 + auVar15._0_4_ * fVar202;
          uStack_4e0._0_4_ = fVar77 * auVar129._8_4_ + auVar15._8_4_ * auVar20._8_4_;
          uStack_4e0._4_4_ = fVar77 * auVar129._12_4_ + auVar15._12_4_ * auVar20._12_4_;
          auVar127 = vmovshdup_avx(auVar129);
          auVar15 = vinsertps_avx(auVar256,auVar294,0x1c);
          auVar326._0_4_ = auVar127._0_4_ * auVar15._0_4_;
          auVar326._4_4_ = auVar127._4_4_ * auVar15._4_4_;
          auVar326._8_4_ = auVar127._8_4_ * auVar15._8_4_;
          auVar326._12_4_ = auVar127._12_4_ * auVar15._12_4_;
          auVar313 = vinsertps_avx(auVar235,auVar280,0x1c);
          auVar305._0_4_ = auVar127._0_4_ * auVar313._0_4_;
          auVar305._4_4_ = auVar127._4_4_ * auVar313._4_4_;
          auVar305._8_4_ = auVar127._8_4_ * auVar313._8_4_;
          auVar305._12_4_ = auVar127._12_4_ * auVar313._12_4_;
          auVar94 = vminps_avx(auVar326,auVar305);
          auVar93 = vmaxps_avx(auVar305,auVar326);
          auVar127 = vinsertps_avx(auVar294,auVar256,0x4c);
          auVar175 = vmovshdup_avx(auVar20);
          auVar79 = vinsertps_avx(auVar280,auVar235,0x4c);
          auVar281._0_4_ = auVar175._0_4_ * auVar127._0_4_;
          auVar281._4_4_ = auVar175._4_4_ * auVar127._4_4_;
          auVar281._8_4_ = auVar175._8_4_ * auVar127._8_4_;
          auVar281._12_4_ = auVar175._12_4_ * auVar127._12_4_;
          auVar295._0_4_ = auVar175._0_4_ * auVar79._0_4_;
          auVar295._4_4_ = auVar175._4_4_ * auVar79._4_4_;
          auVar295._8_4_ = auVar175._8_4_ * auVar79._8_4_;
          auVar295._12_4_ = auVar175._12_4_ * auVar79._12_4_;
          auVar175 = vminps_avx(auVar281,auVar295);
          auVar109._0_4_ = auVar175._0_4_ + auVar94._0_4_;
          auVar109._4_4_ = auVar175._4_4_ + auVar94._4_4_;
          auVar109._8_4_ = auVar175._8_4_ + auVar94._8_4_;
          auVar109._12_4_ = auVar175._12_4_ + auVar94._12_4_;
          auVar94 = vmaxps_avx(auVar295,auVar281);
          auVar282._0_4_ = auVar93._0_4_ + auVar94._0_4_;
          auVar282._4_4_ = auVar93._4_4_ + auVar94._4_4_;
          auVar282._8_4_ = auVar93._8_4_ + auVar94._8_4_;
          auVar282._12_4_ = auVar93._12_4_ + auVar94._12_4_;
          auVar296._8_8_ = 0x3f80000000000000;
          auVar296._0_8_ = 0x3f80000000000000;
          auVar93 = vsubps_avx(auVar296,auVar282);
          auVar94 = vsubps_avx(auVar296,auVar109);
          auVar175 = vsubps_avx(auVar80,auVar90);
          auVar318._0_4_ = fVar201 * auVar15._0_4_;
          auVar318._4_4_ = fVar201 * auVar15._4_4_;
          auVar318._8_4_ = fVar201 * auVar15._8_4_;
          auVar318._12_4_ = fVar201 * auVar15._12_4_;
          auVar306._0_4_ = fVar201 * auVar313._0_4_;
          auVar306._4_4_ = fVar201 * auVar313._4_4_;
          auVar306._8_4_ = fVar201 * auVar313._8_4_;
          auVar306._12_4_ = fVar201 * auVar313._12_4_;
          auVar313 = vminps_avx(auVar318,auVar306);
          auVar15 = vmaxps_avx(auVar306,auVar318);
          auVar257._0_4_ = fVar202 * auVar127._0_4_;
          auVar257._4_4_ = fVar202 * auVar127._4_4_;
          auVar257._8_4_ = fVar202 * auVar127._8_4_;
          auVar257._12_4_ = fVar202 * auVar127._12_4_;
          auVar236._0_4_ = fVar202 * auVar79._0_4_;
          auVar236._4_4_ = fVar202 * auVar79._4_4_;
          auVar236._8_4_ = fVar202 * auVar79._8_4_;
          auVar236._12_4_ = fVar202 * auVar79._12_4_;
          auVar127 = vminps_avx(auVar257,auVar236);
          auVar319._0_4_ = auVar313._0_4_ + auVar127._0_4_;
          auVar319._4_4_ = auVar313._4_4_ + auVar127._4_4_;
          auVar319._8_4_ = auVar313._8_4_ + auVar127._8_4_;
          auVar319._12_4_ = auVar313._12_4_ + auVar127._12_4_;
          auVar127 = vsubps_avx(auVar253,auVar90);
          auVar313 = vmaxps_avx(auVar236,auVar257);
          fVar77 = auVar175._0_4_;
          auVar258._0_4_ = fVar77 * auVar93._0_4_;
          fVar76 = auVar175._4_4_;
          auVar258._4_4_ = fVar76 * auVar93._4_4_;
          fVar141 = auVar175._8_4_;
          auVar258._8_4_ = fVar141 * auVar93._8_4_;
          fVar116 = auVar175._12_4_;
          auVar258._12_4_ = fVar116 * auVar93._12_4_;
          auVar237._0_4_ = auVar15._0_4_ + auVar313._0_4_;
          auVar237._4_4_ = auVar15._4_4_ + auVar313._4_4_;
          auVar237._8_4_ = auVar15._8_4_ + auVar313._8_4_;
          auVar237._12_4_ = auVar15._12_4_ + auVar313._12_4_;
          auVar307._8_8_ = 0x3f800000;
          auVar307._0_8_ = 0x3f800000;
          auVar15 = vsubps_avx(auVar307,auVar237);
          auVar313 = vsubps_avx(auVar307,auVar319);
          auVar320._0_4_ = fVar77 * auVar94._0_4_;
          auVar320._4_4_ = fVar76 * auVar94._4_4_;
          auVar320._8_4_ = fVar141 * auVar94._8_4_;
          auVar320._12_4_ = fVar116 * auVar94._12_4_;
          fVar137 = auVar127._0_4_;
          auVar283._0_4_ = fVar137 * auVar93._0_4_;
          fVar138 = auVar127._4_4_;
          auVar283._4_4_ = fVar138 * auVar93._4_4_;
          fVar139 = auVar127._8_4_;
          auVar283._8_4_ = fVar139 * auVar93._8_4_;
          fVar140 = auVar127._12_4_;
          auVar283._12_4_ = fVar140 * auVar93._12_4_;
          auVar110._0_4_ = fVar137 * auVar94._0_4_;
          auVar110._4_4_ = fVar138 * auVar94._4_4_;
          auVar110._8_4_ = fVar139 * auVar94._8_4_;
          auVar110._12_4_ = fVar140 * auVar94._12_4_;
          auVar334._0_4_ = fVar77 * auVar15._0_4_;
          auVar334._4_4_ = fVar76 * auVar15._4_4_;
          auVar334._8_4_ = fVar141 * auVar15._8_4_;
          auVar334._12_4_ = fVar116 * auVar15._12_4_;
          auVar297._0_4_ = fVar77 * auVar313._0_4_;
          auVar297._4_4_ = fVar76 * auVar313._4_4_;
          auVar297._8_4_ = fVar141 * auVar313._8_4_;
          auVar297._12_4_ = fVar116 * auVar313._12_4_;
          auVar238._0_4_ = fVar137 * auVar15._0_4_;
          auVar238._4_4_ = fVar138 * auVar15._4_4_;
          auVar238._8_4_ = fVar139 * auVar15._8_4_;
          auVar238._12_4_ = fVar140 * auVar15._12_4_;
          auVar308._0_4_ = fVar137 * auVar313._0_4_;
          auVar308._4_4_ = fVar138 * auVar313._4_4_;
          auVar308._8_4_ = fVar139 * auVar313._8_4_;
          auVar308._12_4_ = fVar140 * auVar313._12_4_;
          auVar15 = vminps_avx(auVar334,auVar297);
          auVar313 = vminps_avx(auVar238,auVar308);
          auVar15 = vminps_avx(auVar15,auVar313);
          auVar313 = vmaxps_avx(auVar297,auVar334);
          auVar127 = vminps_avx(auVar258,auVar320);
          auVar79 = vminps_avx(auVar283,auVar110);
          auVar127 = vminps_avx(auVar127,auVar79);
          auVar15 = vhaddps_avx(auVar15,auVar127);
          auVar79 = vmaxps_avx(auVar308,auVar238);
          auVar313 = vmaxps_avx(auVar79,auVar313);
          auVar79 = vmaxps_avx(auVar320,auVar258);
          auVar93 = vmaxps_avx(auVar110,auVar283);
          auVar79 = vmaxps_avx(auVar93,auVar79);
          auVar313 = vhaddps_avx(auVar313,auVar79);
          auVar79 = vshufps_avx(auVar90,auVar90,0x54);
          auVar79 = vsubps_avx(auVar79,_local_4e8);
          auVar15 = vshufps_avx(auVar15,auVar15,0xe8);
          auVar313 = vshufps_avx(auVar313,auVar313,0xe8);
          auVar259._0_4_ = auVar79._0_4_ + auVar15._0_4_;
          auVar259._4_4_ = auVar79._4_4_ + auVar15._4_4_;
          auVar259._8_4_ = auVar79._8_4_ + auVar15._8_4_;
          auVar259._12_4_ = auVar79._12_4_ + auVar15._12_4_;
          auVar239._0_4_ = auVar79._0_4_ + auVar313._0_4_;
          auVar239._4_4_ = auVar79._4_4_ + auVar313._4_4_;
          auVar239._8_4_ = auVar79._8_4_ + auVar313._8_4_;
          auVar239._12_4_ = auVar79._12_4_ + auVar313._12_4_;
          auVar15 = vmaxps_avx(auVar80,auVar259);
          auVar313 = vminps_avx(auVar239,auVar253);
          auVar15 = vcmpps_avx(auVar313,auVar15,1);
          auVar15 = vshufps_avx(auVar15,auVar15,0x50);
          _local_518 = vinsertps_avx(auVar100,ZEXT416((uint)auVar117._0_4_),0x10);
          if ((auVar15 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
              auVar15[0xf] < '\0') goto LAB_0178c430;
          bVar70 = 0;
          if ((auVar220._0_4_ < auVar259._0_4_) && (bVar70 = 0, auVar239._0_4_ < auVar253._0_4_)) {
            auVar313 = vmovshdup_avx(auVar259);
            auVar15 = vcmpps_avx(auVar239,auVar253,1);
            bVar70 = auVar15[4] & auVar100._0_4_ < auVar313._0_4_;
          }
          auVar329 = ZEXT1664(local_328);
          if (((3 < (uint)uVar67 || fVar185 < 0.001) | bVar70) == 1) {
            lVar69 = 200;
            do {
              fVar141 = auVar79._0_4_;
              fVar76 = 1.0 - fVar141;
              fVar185 = fVar76 * fVar76 * fVar76;
              fVar77 = fVar141 * 3.0 * fVar76 * fVar76;
              fVar76 = fVar76 * fVar141 * fVar141 * 3.0;
              auVar198._4_4_ = fVar185;
              auVar198._0_4_ = fVar185;
              auVar198._8_4_ = fVar185;
              auVar198._12_4_ = fVar185;
              auVar131._4_4_ = fVar77;
              auVar131._0_4_ = fVar77;
              auVar131._8_4_ = fVar77;
              auVar131._12_4_ = fVar77;
              auVar111._4_4_ = fVar76;
              auVar111._0_4_ = fVar76;
              auVar111._8_4_ = fVar76;
              auVar111._12_4_ = fVar76;
              fVar141 = fVar141 * fVar141 * fVar141;
              auVar216._0_4_ = (float)local_2b8._0_4_ * fVar141;
              auVar216._4_4_ = (float)local_2b8._4_4_ * fVar141;
              auVar216._8_4_ = fStack_2b0 * fVar141;
              auVar216._12_4_ = fStack_2ac * fVar141;
              auVar15 = vfmadd231ps_fma(auVar216,auVar168,auVar111);
              auVar15 = vfmadd231ps_fma(auVar15,auVar17,auVar131);
              auVar15 = vfmadd231ps_fma(auVar15,auVar16,auVar198);
              auVar112._8_8_ = auVar15._0_8_;
              auVar112._0_8_ = auVar15._0_8_;
              auVar15 = vshufpd_avx(auVar15,auVar15,3);
              auVar313 = vshufps_avx(auVar79,auVar79,0x55);
              auVar15 = vsubps_avx(auVar15,auVar112);
              auVar313 = vfmadd213ps_fma(auVar15,auVar313,auVar112);
              fVar185 = auVar313._0_4_;
              auVar15 = vshufps_avx(auVar313,auVar313,0x55);
              auVar113._0_4_ = fVar201 * fVar185 + fVar202 * auVar15._0_4_;
              auVar113._4_4_ = auVar129._4_4_ * fVar185 + auVar20._4_4_ * auVar15._4_4_;
              auVar113._8_4_ = auVar129._8_4_ * fVar185 + auVar20._8_4_ * auVar15._8_4_;
              auVar113._12_4_ = auVar129._12_4_ * fVar185 + auVar20._12_4_ * auVar15._12_4_;
              auVar79 = vsubps_avx(auVar79,auVar113);
              auVar15 = vandps_avx(local_328,auVar313);
              auVar313 = vshufps_avx(auVar15,auVar15,0xf5);
              auVar15 = vmaxss_avx(auVar313,auVar15);
              if (auVar15._0_4_ < (float)local_1e8._0_4_) {
                fVar185 = auVar79._0_4_;
                if ((0.0 <= fVar185) && (fVar185 <= 1.0)) {
                  auVar15 = vmovshdup_avx(auVar79);
                  fVar201 = auVar15._0_4_;
                  if ((0.0 <= fVar201) && (fVar201 <= 1.0)) {
                    auVar15 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2]),
                                            ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]),0x1c)
                    ;
                    auVar93 = vinsertps_avx(auVar15,ZEXT416((uint)(pre->ray_space).vz.field_0.m128
                                                                  [2]),0x28);
                    aVar5 = (ray->org).field_0;
                    auVar15 = vsubps_avx(local_378,(undefined1  [16])aVar5);
                    auVar15 = vdpps_avx(auVar15,auVar93,0x7f);
                    auVar129 = vsubps_avx(local_388,(undefined1  [16])aVar5);
                    auVar129 = vdpps_avx(auVar129,auVar93,0x7f);
                    auVar20 = vsubps_avx(local_398,(undefined1  [16])aVar5);
                    auVar20 = vdpps_avx(auVar20,auVar93,0x7f);
                    auVar313 = vsubps_avx(local_3a8,(undefined1  [16])aVar5);
                    auVar313 = vdpps_avx(auVar313,auVar93,0x7f);
                    auVar127 = vsubps_avx(_local_3b8,(undefined1  [16])aVar5);
                    auVar127 = vdpps_avx(auVar127,auVar93,0x7f);
                    auVar80 = vsubps_avx(_local_408,(undefined1  [16])aVar5);
                    auVar80 = vdpps_avx(auVar80,auVar93,0x7f);
                    auVar253 = vsubps_avx(_local_418,(undefined1  [16])aVar5);
                    auVar253 = vdpps_avx(auVar253,auVar93,0x7f);
                    auVar94 = vsubps_avx(_local_428,(undefined1  [16])aVar5);
                    auVar93 = vdpps_avx(auVar94,auVar93,0x7f);
                    fVar202 = 1.0 - fVar201;
                    auVar15 = vfmadd231ss_fma(ZEXT416((uint)(auVar127._0_4_ * fVar201)),
                                              ZEXT416((uint)fVar202),auVar15);
                    auVar129 = vfmadd231ss_fma(ZEXT416((uint)(auVar80._0_4_ * fVar201)),
                                               ZEXT416((uint)fVar202),auVar129);
                    auVar20 = vfmadd231ss_fma(ZEXT416((uint)(auVar253._0_4_ * fVar201)),
                                              ZEXT416((uint)fVar202),auVar20);
                    auVar313 = vfmadd231ss_fma(ZEXT416((uint)(fVar201 * auVar93._0_4_)),
                                               ZEXT416((uint)fVar202),auVar313);
                    fVar76 = 1.0 - fVar185;
                    fVar201 = fVar76 * fVar185 * fVar185 * 3.0;
                    fVar116 = fVar185 * fVar185 * fVar185;
                    auVar20 = vfmadd231ss_fma(ZEXT416((uint)(auVar313._0_4_ * fVar116)),
                                              ZEXT416((uint)fVar201),auVar20);
                    fVar202 = fVar185 * 3.0 * fVar76 * fVar76;
                    auVar129 = vfmadd231ss_fma(auVar20,ZEXT416((uint)fVar202),auVar129);
                    fVar77 = fVar76 * fVar76 * fVar76;
                    auVar15 = vfmadd231ss_fma(auVar129,ZEXT416((uint)fVar77),auVar15);
                    fVar141 = auVar15._0_4_;
                    if (((ray->org).field_0.m128[3] <= fVar141) &&
                       (fVar137 = ray->tfar, fVar141 <= fVar137)) {
                      pGVar8 = (context->scene->geometries).items[uVar66].ptr;
                      if ((pGVar8->mask & ray->mask) == 0) {
                        bVar70 = 0;
                      }
                      else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                              (bVar70 = 1, pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                        auVar15 = vshufps_avx(auVar79,auVar79,0x55);
                        auVar260._8_4_ = 0x3f800000;
                        auVar260._0_8_ = &DAT_3f8000003f800000;
                        auVar260._12_4_ = 0x3f800000;
                        auVar129 = vsubps_avx(auVar260,auVar15);
                        fVar138 = auVar15._0_4_;
                        auVar271._0_4_ = fVar138 * (float)local_3b8._0_4_;
                        fVar139 = auVar15._4_4_;
                        auVar271._4_4_ = fVar139 * (float)local_3b8._4_4_;
                        fVar140 = auVar15._8_4_;
                        auVar271._8_4_ = fVar140 * fStack_3b0;
                        fVar160 = auVar15._12_4_;
                        auVar271._12_4_ = fVar160 * fStack_3ac;
                        auVar284._0_4_ = fVar138 * (float)local_408._0_4_;
                        auVar284._4_4_ = fVar139 * (float)local_408._4_4_;
                        auVar284._8_4_ = fVar140 * fStack_400;
                        auVar284._12_4_ = fVar160 * fStack_3fc;
                        auVar298._0_4_ = fVar138 * (float)local_418._0_4_;
                        auVar298._4_4_ = fVar139 * (float)local_418._4_4_;
                        auVar298._8_4_ = fVar140 * fStack_410;
                        auVar298._12_4_ = fVar160 * fStack_40c;
                        auVar240._0_4_ = fVar138 * (float)local_428._0_4_;
                        auVar240._4_4_ = fVar139 * (float)local_428._4_4_;
                        auVar240._8_4_ = fVar140 * fStack_420;
                        auVar240._12_4_ = fVar160 * fStack_41c;
                        auVar15 = vfmadd231ps_fma(auVar271,auVar129,local_378);
                        auVar20 = vfmadd231ps_fma(auVar284,auVar129,local_388);
                        auVar313 = vfmadd231ps_fma(auVar298,auVar129,local_398);
                        auVar127 = vfmadd231ps_fma(auVar240,auVar129,local_3a8);
                        auVar15 = vsubps_avx(auVar20,auVar15);
                        auVar129 = vsubps_avx(auVar313,auVar20);
                        auVar20 = vsubps_avx(auVar127,auVar313);
                        auVar299._0_4_ = fVar185 * auVar129._0_4_;
                        auVar299._4_4_ = fVar185 * auVar129._4_4_;
                        auVar299._8_4_ = fVar185 * auVar129._8_4_;
                        auVar299._12_4_ = fVar185 * auVar129._12_4_;
                        auVar217._4_4_ = fVar76;
                        auVar217._0_4_ = fVar76;
                        auVar217._8_4_ = fVar76;
                        auVar217._12_4_ = fVar76;
                        auVar15 = vfmadd231ps_fma(auVar299,auVar217,auVar15);
                        auVar241._0_4_ = fVar185 * auVar20._0_4_;
                        auVar241._4_4_ = fVar185 * auVar20._4_4_;
                        auVar241._8_4_ = fVar185 * auVar20._8_4_;
                        auVar241._12_4_ = fVar185 * auVar20._12_4_;
                        auVar129 = vfmadd231ps_fma(auVar241,auVar217,auVar129);
                        auVar242._0_4_ = fVar185 * auVar129._0_4_;
                        auVar242._4_4_ = fVar185 * auVar129._4_4_;
                        auVar242._8_4_ = fVar185 * auVar129._8_4_;
                        auVar242._12_4_ = fVar185 * auVar129._12_4_;
                        auVar129 = vfmadd231ps_fma(auVar242,auVar217,auVar15);
                        auVar199._0_4_ = fVar116 * (float)local_248._0_4_;
                        auVar199._4_4_ = fVar116 * (float)local_248._4_4_;
                        auVar199._8_4_ = fVar116 * fStack_240;
                        auVar199._12_4_ = fVar116 * fStack_23c;
                        auVar132._4_4_ = fVar201;
                        auVar132._0_4_ = fVar201;
                        auVar132._8_4_ = fVar201;
                        auVar132._12_4_ = fVar201;
                        auVar15 = vfmadd132ps_fma(auVar132,auVar199,local_238);
                        auVar181._4_4_ = fVar202;
                        auVar181._0_4_ = fVar202;
                        auVar181._8_4_ = fVar202;
                        auVar181._12_4_ = fVar202;
                        auVar15 = vfmadd132ps_fma(auVar181,auVar15,local_228);
                        auVar133._0_4_ = auVar129._0_4_ * 3.0;
                        auVar133._4_4_ = auVar129._4_4_ * 3.0;
                        auVar133._8_4_ = auVar129._8_4_ * 3.0;
                        auVar133._12_4_ = auVar129._12_4_ * 3.0;
                        auVar156._4_4_ = fVar77;
                        auVar156._0_4_ = fVar77;
                        auVar156._8_4_ = fVar77;
                        auVar156._12_4_ = fVar77;
                        auVar129 = vfmadd132ps_fma(auVar156,auVar15,local_218);
                        auVar15 = vshufps_avx(auVar133,auVar133,0xc9);
                        auVar182._0_4_ = auVar129._0_4_ * auVar15._0_4_;
                        auVar182._4_4_ = auVar129._4_4_ * auVar15._4_4_;
                        auVar182._8_4_ = auVar129._8_4_ * auVar15._8_4_;
                        auVar182._12_4_ = auVar129._12_4_ * auVar15._12_4_;
                        auVar15 = vshufps_avx(auVar129,auVar129,0xc9);
                        auVar129 = vfmsub231ps_fma(auVar182,auVar133,auVar15);
                        auVar15 = vshufps_avx(auVar129,auVar129,0xe9);
                        local_298 = vmovlps_avx(auVar15);
                        local_290 = auVar129._0_4_;
                        local_28c = vmovlps_avx(auVar79);
                        local_284 = (int)local_2f8;
                        local_280 = uVar66;
                        local_27c = context->user->instID[0];
                        local_278 = context->user->instPrimID[0];
                        ray->tfar = fVar141;
                        local_46c = -1;
                        local_2e8.valid = &local_46c;
                        local_2e8.geometryUserPtr = pGVar8->userPtr;
                        local_2e8.context = context->user;
                        local_2e8.hit = (RTCHitN *)&local_298;
                        local_2e8.N = 1;
                        local_268._0_4_ = (int)uVar73;
                        local_2e8.ray = (RTCRayN *)ray;
                        if (pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0178c393:
                          p_Var14 = context->args->filter;
                          if (p_Var14 != (RTCFilterFunctionN)0x0) {
                            if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar8->field_8).field_0x2 & 0x40) != 0)) {
                              auVar329 = ZEXT1664(auVar329._0_16_);
                              (*p_Var14)(&local_2e8);
                              uVar73 = (ulong)(uint)local_268._0_4_;
                            }
                            if (*local_2e8.valid == 0) {
                              bVar70 = 0;
                              goto LAB_0178c472;
                            }
                          }
                          bVar70 = 1;
                        }
                        else {
                          _fStack_460 = auVar22._8_24_;
                          local_468 = auVar75;
                          auVar329 = ZEXT1664(local_328);
                          (*pGVar8->occlusionFilterN)(&local_2e8);
                          uVar73 = (ulong)(uint)local_268._0_4_;
                          auVar75 = local_468;
                          if (*local_2e8.valid != 0) goto LAB_0178c393;
                          bVar70 = 0;
                        }
LAB_0178c472:
                        if (bVar70 == 0) {
                          ray->tfar = fVar137;
                        }
                      }
                      uVar73 = CONCAT71((int7)(uVar73 >> 8),(byte)uVar73 | bVar70);
                    }
                  }
                }
                break;
              }
              lVar69 = lVar69 + -1;
            } while (lVar69 != 0);
          }
          else {
            bVar53 = false;
          }
        }
      }
    } while (bVar53);
    local_1f8 = vinsertps_avx(auVar21,ZEXT416((uint)local_448),0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray.org, primID,ray.time());

          if (Intersector().intersect(pre,ray,context,geom,primID,curve,Epilog(ray,context,geomID,primID)))
              return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }